

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCRayQueryContext *pRVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  byte bVar75;
  byte bVar76;
  byte bVar77;
  ulong uVar78;
  ulong uVar79;
  byte bVar80;
  byte bVar81;
  int iVar82;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  uint uVar83;
  long lVar84;
  byte bVar85;
  undefined1 uVar86;
  undefined1 uVar87;
  ulong uVar88;
  uint uVar89;
  uint uVar90;
  uint uVar154;
  uint uVar155;
  uint uVar157;
  uint uVar158;
  uint uVar159;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  uint uVar156;
  uint uVar160;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar153 [32];
  float pp;
  float fVar161;
  undefined4 uVar162;
  undefined1 auVar164 [16];
  undefined1 auVar169 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar167 [16];
  float fVar163;
  undefined1 auVar168 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar240 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar175;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar187 [32];
  undefined1 auVar176 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar221;
  float fVar222;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [32];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar6 = prim[1];
  uVar79 = (ulong)(byte)PVar6;
  fVar222 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar25 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar97 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar100 = vsubps_avx(auVar93,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  fVar221 = fVar222 * auVar100._0_4_;
  fVar161 = fVar222 * auVar97._0_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar109 = vpmovsxbd_avx2(auVar93);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar107 = vpmovsxbd_avx2(auVar25);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar110 = vpmovsxbd_avx2(auVar91);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar111 = vpmovsxbd_avx2(auVar5);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar116 = vpmovsxbd_avx2(auVar94);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar112 = vcvtdq2ps_avx(auVar116);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar79 + 6);
  auVar108 = vpmovsxbd_avx2(auVar99);
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar78 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar113 = vpmovsxbd_avx2(auVar95);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar78 + uVar79 + 6);
  auVar114 = vpmovsxbd_avx2(auVar92);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar88 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar106 = vpmovsxbd_avx2(auVar96);
  auVar115 = vcvtdq2ps_avx(auVar106);
  auVar126._4_4_ = fVar161;
  auVar126._0_4_ = fVar161;
  auVar126._8_4_ = fVar161;
  auVar126._12_4_ = fVar161;
  auVar126._16_4_ = fVar161;
  auVar126._20_4_ = fVar161;
  auVar126._24_4_ = fVar161;
  auVar126._28_4_ = fVar161;
  auVar128._8_4_ = 1;
  auVar128._0_8_ = 0x100000001;
  auVar128._12_4_ = 1;
  auVar128._16_4_ = 1;
  auVar128._20_4_ = 1;
  auVar128._24_4_ = 1;
  auVar128._28_4_ = 1;
  auVar104 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar118 = ZEXT1632(CONCAT412(fVar222 * auVar97._12_4_,
                                CONCAT48(fVar222 * auVar97._8_4_,
                                         CONCAT44(fVar222 * auVar97._4_4_,fVar161))));
  auVar117 = vpermps_avx2(auVar128,auVar118);
  auVar105 = vpermps_avx512vl(auVar104,auVar118);
  fVar161 = auVar105._0_4_;
  fVar191 = auVar105._4_4_;
  auVar118._4_4_ = fVar191 * auVar110._4_4_;
  auVar118._0_4_ = fVar161 * auVar110._0_4_;
  fVar193 = auVar105._8_4_;
  auVar118._8_4_ = fVar193 * auVar110._8_4_;
  fVar195 = auVar105._12_4_;
  auVar118._12_4_ = fVar195 * auVar110._12_4_;
  fVar163 = auVar105._16_4_;
  auVar118._16_4_ = fVar163 * auVar110._16_4_;
  fVar197 = auVar105._20_4_;
  auVar118._20_4_ = fVar197 * auVar110._20_4_;
  fVar199 = auVar105._24_4_;
  auVar118._24_4_ = fVar199 * auVar110._24_4_;
  auVar118._28_4_ = auVar116._28_4_;
  auVar116._4_4_ = auVar108._4_4_ * fVar191;
  auVar116._0_4_ = auVar108._0_4_ * fVar161;
  auVar116._8_4_ = auVar108._8_4_ * fVar193;
  auVar116._12_4_ = auVar108._12_4_ * fVar195;
  auVar116._16_4_ = auVar108._16_4_ * fVar163;
  auVar116._20_4_ = auVar108._20_4_ * fVar197;
  auVar116._24_4_ = auVar108._24_4_ * fVar199;
  auVar116._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar115._4_4_ * fVar191;
  auVar106._0_4_ = auVar115._0_4_ * fVar161;
  auVar106._8_4_ = auVar115._8_4_ * fVar193;
  auVar106._12_4_ = auVar115._12_4_ * fVar195;
  auVar106._16_4_ = auVar115._16_4_ * fVar163;
  auVar106._20_4_ = auVar115._20_4_ * fVar197;
  auVar106._24_4_ = auVar115._24_4_ * fVar199;
  auVar106._28_4_ = auVar105._28_4_;
  auVar93 = vfmadd231ps_fma(auVar118,auVar117,auVar107);
  auVar25 = vfmadd231ps_fma(auVar116,auVar117,auVar112);
  auVar91 = vfmadd231ps_fma(auVar106,auVar114,auVar117);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar126,auVar109);
  auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar126,auVar111);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar113,auVar126);
  auVar127._4_4_ = fVar221;
  auVar127._0_4_ = fVar221;
  auVar127._8_4_ = fVar221;
  auVar127._12_4_ = fVar221;
  auVar127._16_4_ = fVar221;
  auVar127._20_4_ = fVar221;
  auVar127._24_4_ = fVar221;
  auVar127._28_4_ = fVar221;
  auVar106 = ZEXT1632(CONCAT412(fVar222 * auVar100._12_4_,
                                CONCAT48(fVar222 * auVar100._8_4_,
                                         CONCAT44(fVar222 * auVar100._4_4_,fVar221))));
  auVar116 = vpermps_avx2(auVar128,auVar106);
  auVar106 = vpermps_avx512vl(auVar104,auVar106);
  fVar222 = auVar106._0_4_;
  fVar161 = auVar106._4_4_;
  auVar117._4_4_ = fVar161 * auVar110._4_4_;
  auVar117._0_4_ = fVar222 * auVar110._0_4_;
  fVar191 = auVar106._8_4_;
  auVar117._8_4_ = fVar191 * auVar110._8_4_;
  fVar193 = auVar106._12_4_;
  auVar117._12_4_ = fVar193 * auVar110._12_4_;
  fVar195 = auVar106._16_4_;
  auVar117._16_4_ = fVar195 * auVar110._16_4_;
  fVar163 = auVar106._20_4_;
  auVar117._20_4_ = fVar163 * auVar110._20_4_;
  fVar197 = auVar106._24_4_;
  auVar117._24_4_ = fVar197 * auVar110._24_4_;
  auVar117._28_4_ = 1;
  auVar104._4_4_ = auVar108._4_4_ * fVar161;
  auVar104._0_4_ = auVar108._0_4_ * fVar222;
  auVar104._8_4_ = auVar108._8_4_ * fVar191;
  auVar104._12_4_ = auVar108._12_4_ * fVar193;
  auVar104._16_4_ = auVar108._16_4_ * fVar195;
  auVar104._20_4_ = auVar108._20_4_ * fVar163;
  auVar104._24_4_ = auVar108._24_4_ * fVar197;
  auVar104._28_4_ = auVar110._28_4_;
  auVar108._4_4_ = auVar115._4_4_ * fVar161;
  auVar108._0_4_ = auVar115._0_4_ * fVar222;
  auVar108._8_4_ = auVar115._8_4_ * fVar191;
  auVar108._12_4_ = auVar115._12_4_ * fVar193;
  auVar108._16_4_ = auVar115._16_4_ * fVar195;
  auVar108._20_4_ = auVar115._20_4_ * fVar163;
  auVar108._24_4_ = auVar115._24_4_ * fVar197;
  auVar108._28_4_ = auVar106._28_4_;
  auVar5 = vfmadd231ps_fma(auVar117,auVar116,auVar107);
  auVar94 = vfmadd231ps_fma(auVar104,auVar116,auVar112);
  auVar99 = vfmadd231ps_fma(auVar108,auVar116,auVar114);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar127,auVar109);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar127,auVar111);
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar127,auVar113);
  auVar109 = vandps_avx(ZEXT1632(auVar93),auVar123);
  auVar125._8_4_ = 0x219392ef;
  auVar125._0_8_ = 0x219392ef219392ef;
  auVar125._12_4_ = 0x219392ef;
  auVar125._16_4_ = 0x219392ef;
  auVar125._20_4_ = 0x219392ef;
  auVar125._24_4_ = 0x219392ef;
  auVar125._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar109,auVar125,1);
  bVar11 = (bool)((byte)uVar78 & 1);
  auVar105._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar93._0_4_;
  bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar93._4_4_;
  bVar11 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar93._8_4_;
  bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar93._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar25),auVar123);
  uVar78 = vcmpps_avx512vl(auVar109,auVar125,1);
  bVar11 = (bool)((byte)uVar78 & 1);
  auVar119._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar25._0_4_;
  bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar25._4_4_;
  bVar11 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar25._8_4_;
  bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar25._12_4_;
  auVar119._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar119._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar119._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar119._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar91),auVar123);
  uVar78 = vcmpps_avx512vl(auVar109,auVar125,1);
  bVar11 = (bool)((byte)uVar78 & 1);
  auVar109._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar91._0_4_;
  bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar91._4_4_;
  bVar11 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar91._8_4_;
  bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar91._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar107 = vrcp14ps_avx512vl(auVar105);
  auVar124._8_4_ = 0x3f800000;
  auVar124._0_8_ = 0x3f8000003f800000;
  auVar124._12_4_ = 0x3f800000;
  auVar124._16_4_ = 0x3f800000;
  auVar124._20_4_ = 0x3f800000;
  auVar124._24_4_ = 0x3f800000;
  auVar124._28_4_ = 0x3f800000;
  auVar93 = vfnmadd213ps_fma(auVar105,auVar107,auVar124);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar107,auVar107);
  auVar107 = vrcp14ps_avx512vl(auVar119);
  auVar25 = vfnmadd213ps_fma(auVar119,auVar107,auVar124);
  auVar25 = vfmadd132ps_fma(ZEXT1632(auVar25),auVar107,auVar107);
  auVar107 = vrcp14ps_avx512vl(auVar109);
  auVar91 = vfnmadd213ps_fma(auVar109,auVar107,auVar124);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar107,auVar107);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar5));
  auVar113._4_4_ = auVar93._4_4_ * auVar109._4_4_;
  auVar113._0_4_ = auVar93._0_4_ * auVar109._0_4_;
  auVar113._8_4_ = auVar93._8_4_ * auVar109._8_4_;
  auVar113._12_4_ = auVar93._12_4_ * auVar109._12_4_;
  auVar113._16_4_ = auVar109._16_4_ * 0.0;
  auVar113._20_4_ = auVar109._20_4_ * 0.0;
  auVar113._24_4_ = auVar109._24_4_ * 0.0;
  auVar113._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar5));
  auVar108 = vpbroadcastd_avx512vl();
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar122._0_4_ = auVar93._0_4_ * auVar109._0_4_;
  auVar122._4_4_ = auVar93._4_4_ * auVar109._4_4_;
  auVar122._8_4_ = auVar93._8_4_ * auVar109._8_4_;
  auVar122._12_4_ = auVar93._12_4_ * auVar109._12_4_;
  auVar122._16_4_ = auVar109._16_4_ * 0.0;
  auVar122._20_4_ = auVar109._20_4_ * 0.0;
  auVar122._24_4_ = auVar109._24_4_ * 0.0;
  auVar122._28_4_ = 0;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar6 * 0x10 + uVar79 * -2 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar94));
  auVar114._4_4_ = auVar25._4_4_ * auVar109._4_4_;
  auVar114._0_4_ = auVar25._0_4_ * auVar109._0_4_;
  auVar114._8_4_ = auVar25._8_4_ * auVar109._8_4_;
  auVar114._12_4_ = auVar25._12_4_ * auVar109._12_4_;
  auVar114._16_4_ = auVar109._16_4_ * 0.0;
  auVar114._20_4_ = auVar109._20_4_ * 0.0;
  auVar114._24_4_ = auVar109._24_4_ * 0.0;
  auVar114._28_4_ = auVar109._28_4_;
  auVar109 = vcvtdq2ps_avx(auVar107);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar94));
  auVar121._0_4_ = auVar25._0_4_ * auVar109._0_4_;
  auVar121._4_4_ = auVar25._4_4_ * auVar109._4_4_;
  auVar121._8_4_ = auVar25._8_4_ * auVar109._8_4_;
  auVar121._12_4_ = auVar25._12_4_ * auVar109._12_4_;
  auVar121._16_4_ = auVar109._16_4_ * 0.0;
  auVar121._20_4_ = auVar109._20_4_ * 0.0;
  auVar121._24_4_ = auVar109._24_4_ * 0.0;
  auVar121._28_4_ = 0;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 + uVar79 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar99));
  auVar115._4_4_ = auVar109._4_4_ * auVar91._4_4_;
  auVar115._0_4_ = auVar109._0_4_ * auVar91._0_4_;
  auVar115._8_4_ = auVar109._8_4_ * auVar91._8_4_;
  auVar115._12_4_ = auVar109._12_4_ * auVar91._12_4_;
  auVar115._16_4_ = auVar109._16_4_ * 0.0;
  auVar115._20_4_ = auVar109._20_4_ * 0.0;
  auVar115._24_4_ = auVar109._24_4_ * 0.0;
  auVar115._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar99));
  auVar120._0_4_ = auVar91._0_4_ * auVar109._0_4_;
  auVar120._4_4_ = auVar91._4_4_ * auVar109._4_4_;
  auVar120._8_4_ = auVar91._8_4_ * auVar109._8_4_;
  auVar120._12_4_ = auVar91._12_4_ * auVar109._12_4_;
  auVar120._16_4_ = auVar109._16_4_ * 0.0;
  auVar120._20_4_ = auVar109._20_4_ * 0.0;
  auVar120._24_4_ = auVar109._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar109 = vpminsd_avx2(auVar113,auVar122);
  auVar107 = vpminsd_avx2(auVar114,auVar121);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107 = vpminsd_avx2(auVar115,auVar120);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar110._4_4_ = uVar162;
  auVar110._0_4_ = uVar162;
  auVar110._8_4_ = uVar162;
  auVar110._12_4_ = uVar162;
  auVar110._16_4_ = uVar162;
  auVar110._20_4_ = uVar162;
  auVar110._24_4_ = uVar162;
  auVar110._28_4_ = uVar162;
  auVar107 = vmaxps_avx512vl(auVar107,auVar110);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107._8_4_ = 0x3f7ffffa;
  auVar107._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar107._12_4_ = 0x3f7ffffa;
  auVar107._16_4_ = 0x3f7ffffa;
  auVar107._20_4_ = 0x3f7ffffa;
  auVar107._24_4_ = 0x3f7ffffa;
  auVar107._28_4_ = 0x3f7ffffa;
  local_5c0 = vmulps_avx512vl(auVar109,auVar107);
  auVar109 = vpmaxsd_avx2(auVar113,auVar122);
  auVar107 = vpmaxsd_avx2(auVar114,auVar121);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar107 = vpmaxsd_avx2(auVar115,auVar120);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar111._4_4_ = uVar162;
  auVar111._0_4_ = uVar162;
  auVar111._8_4_ = uVar162;
  auVar111._12_4_ = uVar162;
  auVar111._16_4_ = uVar162;
  auVar111._20_4_ = uVar162;
  auVar111._24_4_ = uVar162;
  auVar111._28_4_ = uVar162;
  auVar107 = vminps_avx512vl(auVar107,auVar111);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar112._8_4_ = 0x3f800003;
  auVar112._0_8_ = 0x3f8000033f800003;
  auVar112._12_4_ = 0x3f800003;
  auVar112._16_4_ = 0x3f800003;
  auVar112._20_4_ = 0x3f800003;
  auVar112._24_4_ = 0x3f800003;
  auVar112._28_4_ = 0x3f800003;
  auVar109 = vmulps_avx512vl(auVar109,auVar112);
  uVar27 = vpcmpgtd_avx512vl(auVar108,_DAT_01fe9900);
  uVar26 = vcmpps_avx512vl(local_5c0,auVar109,2);
  if ((byte)((byte)uVar26 & (byte)uVar27) == 0) {
    return;
  }
  local_908 = (ulong)(byte)((byte)uVar26 & (byte)uVar27);
  local_a48 = (undefined1 (*) [32])local_240;
  auVar174 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar174);
  local_910 = prim;
LAB_01ce4cda:
  lVar84 = 0;
  for (uVar78 = local_908; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar84 = lVar84 + 1;
  }
  uVar83 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar84 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar83].ptr;
  lVar84 = *(long *)&pGVar8[1].time_range.upper;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar93 = *(undefined1 (*) [16])(lVar84 + (long)pGVar8[1].intersectionFilterN * uVar78);
  auVar25 = *(undefined1 (*) [16])(lVar84 + (long)pGVar8[1].intersectionFilterN * (uVar78 + 1));
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar5 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar91 = vunpcklps_avx512vl(local_760._0_16_,local_780._0_16_);
  local_a00 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar266 = ZEXT3264(local_a00);
  auVar96 = local_a00._0_16_;
  local_a10 = vinsertps_avx512f(auVar91,auVar96,0x28);
  auVar100._8_4_ = 0xbeaaaaab;
  auVar100._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar100._12_4_ = 0xbeaaaaab;
  auVar99 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar8[2].intersectionFilterN +
                              uVar78 * (long)pGVar8[2].pointQueryFunc),auVar93,auVar100);
  auVar94 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar8[2].intersectionFilterN +
                             (long)pGVar8[2].pointQueryFunc * (uVar78 + 1)),auVar25,auVar100);
  auVar101._0_4_ = auVar25._0_4_ + auVar93._0_4_ + auVar99._0_4_ + auVar94._0_4_;
  auVar101._4_4_ = auVar25._4_4_ + auVar93._4_4_ + auVar99._4_4_ + auVar94._4_4_;
  auVar101._8_4_ = auVar25._8_4_ + auVar93._8_4_ + auVar99._8_4_ + auVar94._8_4_;
  auVar101._12_4_ = auVar25._12_4_ + auVar93._12_4_ + auVar99._12_4_ + auVar94._12_4_;
  auVar97._8_4_ = 0x3e800000;
  auVar97._0_8_ = 0x3e8000003e800000;
  auVar97._12_4_ = 0x3e800000;
  auVar91 = vmulps_avx512vl(auVar101,auVar97);
  auVar91 = vsubps_avx(auVar91,auVar5);
  auVar91 = vdpps_avx(auVar91,local_a10,0x7f);
  fVar222 = *(float *)(ray + k * 4 + 0xc0);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar98._4_12_ = ZEXT812(0) << 0x20;
  auVar98._0_4_ = local_a20._0_4_;
  auVar92 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar98);
  auVar95 = vfnmadd213ss_fma(auVar92,local_a20,ZEXT416(0x40000000));
  local_5a0 = auVar91._0_4_ * auVar92._0_4_ * auVar95._0_4_;
  auVar102._4_4_ = local_5a0;
  auVar102._0_4_ = local_5a0;
  auVar102._8_4_ = local_5a0;
  auVar102._12_4_ = local_5a0;
  fStack_9b0 = local_5a0;
  _local_9c0 = auVar102;
  fStack_9ac = local_5a0;
  fStack_9a8 = local_5a0;
  fStack_9a4 = local_5a0;
  auVar91 = vfmadd231ps_fma(auVar5,local_a10,auVar102);
  auVar91 = vblendps_avx(auVar91,ZEXT816(0) << 0x40,8);
  auVar93 = vsubps_avx(auVar93,auVar91);
  auVar5 = vsubps_avx(auVar94,auVar91);
  auVar94 = vsubps_avx(auVar99,auVar91);
  auVar25 = vsubps_avx(auVar25,auVar91);
  uVar162 = auVar93._0_4_;
  auVar257._4_4_ = uVar162;
  auVar257._0_4_ = uVar162;
  auVar257._8_4_ = uVar162;
  auVar257._12_4_ = uVar162;
  auVar257._16_4_ = uVar162;
  auVar257._20_4_ = uVar162;
  auVar257._24_4_ = uVar162;
  auVar257._28_4_ = uVar162;
  auVar130._8_4_ = 1;
  auVar130._0_8_ = 0x100000001;
  auVar130._12_4_ = 1;
  auVar130._16_4_ = 1;
  auVar130._20_4_ = 1;
  auVar130._24_4_ = 1;
  auVar130._28_4_ = 1;
  local_880 = ZEXT1632(auVar93);
  auVar109 = vpermps_avx2(auVar130,local_880);
  auVar131._8_4_ = 2;
  auVar131._0_8_ = 0x200000002;
  auVar131._12_4_ = 2;
  auVar131._16_4_ = 2;
  auVar131._20_4_ = 2;
  auVar131._24_4_ = 2;
  auVar131._28_4_ = 2;
  auVar110 = vpermps_avx512vl(auVar131,local_880);
  auVar132._8_4_ = 3;
  auVar132._0_8_ = 0x300000003;
  auVar132._12_4_ = 3;
  auVar132._16_4_ = 3;
  auVar132._20_4_ = 3;
  auVar132._24_4_ = 3;
  auVar132._28_4_ = 3;
  local_aa0 = vpermps_avx2(auVar132,local_880);
  auVar262 = ZEXT3264(local_aa0);
  uVar162 = auVar94._0_4_;
  local_860._4_4_ = uVar162;
  local_860._0_4_ = uVar162;
  local_860._8_4_ = uVar162;
  local_860._12_4_ = uVar162;
  local_860._16_4_ = uVar162;
  local_860._20_4_ = uVar162;
  local_860._24_4_ = uVar162;
  local_860._28_4_ = uVar162;
  auVar253 = ZEXT3264(local_860);
  local_8c0 = ZEXT1632(auVar94);
  local_9e0 = vpermps_avx2(auVar130,local_8c0);
  auVar107 = vpermps_avx2(auVar131,local_8c0);
  auVar111 = vpermps_avx512vl(auVar132,local_8c0);
  auVar112 = vbroadcastss_avx512vl(auVar5);
  local_8a0 = ZEXT1632(auVar5);
  auVar108 = vpermps_avx512vl(auVar130,local_8a0);
  local_ac0 = vpermps_avx512vl(auVar131,local_8a0);
  auVar263 = ZEXT3264(local_ac0);
  auVar113 = vpermps_avx512vl(auVar132,local_8a0);
  auVar241 = ZEXT3264(local_9e0);
  local_ae0 = vbroadcastss_avx512vl(auVar25);
  auVar264 = ZEXT3264(local_ae0);
  _local_8e0 = ZEXT1632(auVar25);
  auVar114 = vpermps_avx512vl(auVar130,_local_8e0);
  local_b00 = vpermps_avx512vl(auVar131,_local_8e0);
  auVar265 = ZEXT3264(local_b00);
  auVar115 = vpermps_avx512vl(auVar132,_local_8e0);
  auVar93 = vmulss_avx512f(auVar96,auVar96);
  auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),local_780,local_780);
  local_580 = vfmadd231ps_avx512vl(auVar116,local_760,local_760);
  uVar162 = local_580._0_4_;
  local_560._4_4_ = uVar162;
  local_560._0_4_ = uVar162;
  local_560._8_4_ = uVar162;
  local_560._12_4_ = uVar162;
  local_560._16_4_ = uVar162;
  local_560._20_4_ = uVar162;
  local_560._24_4_ = uVar162;
  local_560._28_4_ = uVar162;
  auVar129._8_4_ = 0x7fffffff;
  auVar129._0_8_ = 0x7fffffff7fffffff;
  auVar129._12_4_ = 0x7fffffff;
  auVar129._16_4_ = 0x7fffffff;
  auVar129._20_4_ = 0x7fffffff;
  auVar129._24_4_ = 0x7fffffff;
  auVar129._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar129);
  local_970 = ZEXT416((uint)local_5a0);
  local_5a0 = fVar222 - local_5a0;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  auVar174 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar174);
  uVar78 = 0;
  iVar82 = 1;
  auVar174 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar174);
  auVar93 = vsqrtss_avx(local_a20,local_a20);
  auVar25 = vsqrtss_avx(local_a20,local_a20);
  local_670 = ZEXT816(0x3f80000000000000);
  auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar174 = ZEXT3264(auVar116);
  do {
    auVar91 = vmovshdup_avx(local_670);
    auVar91 = vsubps_avx(auVar91,local_670);
    fVar161 = auVar91._0_4_;
    fVar163 = fVar161 * 0.04761905;
    auVar235._0_4_ = local_670._0_4_;
    auVar235._4_4_ = auVar235._0_4_;
    auVar235._8_4_ = auVar235._0_4_;
    auVar235._12_4_ = auVar235._0_4_;
    auVar235._16_4_ = auVar235._0_4_;
    auVar235._20_4_ = auVar235._0_4_;
    auVar235._24_4_ = auVar235._0_4_;
    auVar235._28_4_ = auVar235._0_4_;
    auVar247._4_4_ = fVar161;
    auVar247._0_4_ = fVar161;
    auVar247._8_4_ = fVar161;
    auVar247._12_4_ = fVar161;
    auVar247._16_4_ = fVar161;
    auVar247._20_4_ = fVar161;
    auVar247._24_4_ = fVar161;
    auVar247._28_4_ = fVar161;
    auVar91 = vfmadd231ps_fma(auVar235,auVar247,_DAT_01faff20);
    auVar267 = auVar174._0_32_;
    auVar116 = vsubps_avx512vl(auVar267,ZEXT1632(auVar91));
    fVar161 = auVar91._0_4_;
    fVar191 = auVar91._4_4_;
    auVar73._4_4_ = auVar253._4_4_ * fVar191;
    auVar73._0_4_ = auVar253._0_4_ * fVar161;
    fVar193 = auVar91._8_4_;
    auVar73._8_4_ = auVar253._8_4_ * fVar193;
    fVar195 = auVar91._12_4_;
    auVar73._12_4_ = auVar253._12_4_ * fVar195;
    auVar73._16_4_ = auVar253._16_4_ * 0.0;
    auVar73._20_4_ = auVar253._20_4_ * 0.0;
    auVar73._24_4_ = auVar253._24_4_ * 0.0;
    auVar73._28_4_ = DAT_01faff20._28_4_;
    auVar137._4_4_ = auVar241._4_4_ * fVar191;
    auVar137._0_4_ = auVar241._0_4_ * fVar161;
    auVar137._8_4_ = auVar241._8_4_ * fVar193;
    auVar137._12_4_ = auVar241._12_4_ * fVar195;
    auVar137._16_4_ = auVar241._16_4_ * 0.0;
    auVar137._20_4_ = auVar241._20_4_ * 0.0;
    auVar137._24_4_ = auVar241._24_4_ * 0.0;
    auVar137._28_4_ = auVar235._0_4_;
    auVar242._0_4_ = auVar107._0_4_ * fVar161;
    auVar242._4_4_ = auVar107._4_4_ * fVar191;
    auVar242._8_4_ = auVar107._8_4_ * fVar193;
    auVar242._12_4_ = auVar107._12_4_ * fVar195;
    auVar242._16_4_ = auVar107._16_4_ * 0.0;
    auVar242._20_4_ = auVar107._20_4_ * 0.0;
    auVar242._28_36_ = auVar241._28_36_;
    auVar242._24_4_ = auVar107._24_4_ * 0.0;
    auVar106 = vmulps_avx512vl(auVar111,ZEXT1632(auVar91));
    auVar5 = vfmadd231ps_fma(auVar73,auVar116,auVar257);
    auVar94 = vfmadd231ps_fma(auVar137,auVar116,auVar109);
    auVar117 = vfmadd231ps_avx512vl(auVar242._0_32_,auVar116,auVar110);
    auVar99 = vfmadd231ps_fma(auVar106,auVar116,auVar262._0_32_);
    auVar106 = vmulps_avx512vl(auVar112,ZEXT1632(auVar91));
    auVar120 = ZEXT1632(auVar91);
    auVar118 = vmulps_avx512vl(auVar108,auVar120);
    auVar104 = vmulps_avx512vl(auVar263._0_32_,auVar120);
    auVar105 = vmulps_avx512vl(auVar113,auVar120);
    auVar95 = vfmadd231ps_fma(auVar106,auVar116,auVar253._0_32_);
    auVar92 = vfmadd231ps_fma(auVar118,auVar116,auVar241._0_32_);
    auVar96 = vfmadd231ps_fma(auVar104,auVar116,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar105,auVar116,auVar111);
    auVar118 = vmulps_avx512vl(auVar264._0_32_,auVar120);
    auVar104 = vmulps_avx512vl(auVar114,auVar120);
    auVar105 = vmulps_avx512vl(auVar265._0_32_,auVar120);
    auVar119 = vmulps_avx512vl(auVar115,auVar120);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,auVar112);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,auVar108);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar116,auVar263._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,auVar113);
    auVar74._28_4_ = auVar107._28_4_;
    auVar74._0_28_ =
         ZEXT1628(CONCAT412(fVar195 * auVar95._12_4_,
                            CONCAT48(fVar193 * auVar95._8_4_,
                                     CONCAT44(fVar191 * auVar95._4_4_,fVar161 * auVar95._0_4_))));
    auVar120 = vmulps_avx512vl(auVar120,ZEXT1632(auVar92));
    auVar121 = vmulps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar96));
    auVar122 = vmulps_avx512vl(ZEXT1632(auVar91),auVar106);
    auVar91 = vfmadd231ps_fma(auVar74,auVar116,ZEXT1632(auVar5));
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,ZEXT1632(auVar94));
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar116,auVar117);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar116,ZEXT1632(auVar99));
    auVar251._0_4_ = auVar118._0_4_ * fVar161;
    auVar251._4_4_ = auVar118._4_4_ * fVar191;
    auVar251._8_4_ = auVar118._8_4_ * fVar193;
    auVar251._12_4_ = auVar118._12_4_ * fVar195;
    auVar251._16_4_ = auVar118._16_4_ * 0.0;
    auVar251._20_4_ = auVar118._20_4_ * 0.0;
    auVar251._24_4_ = auVar118._24_4_ * 0.0;
    auVar251._28_4_ = 0;
    auVar138._4_4_ = auVar104._4_4_ * fVar191;
    auVar138._0_4_ = auVar104._0_4_ * fVar161;
    auVar138._8_4_ = auVar104._8_4_ * fVar193;
    auVar138._12_4_ = auVar104._12_4_ * fVar195;
    auVar138._16_4_ = auVar104._16_4_ * 0.0;
    auVar138._20_4_ = auVar104._20_4_ * 0.0;
    auVar138._24_4_ = auVar104._24_4_ * 0.0;
    auVar138._28_4_ = auVar118._28_4_;
    auVar141._4_4_ = auVar105._4_4_ * fVar191;
    auVar141._0_4_ = auVar105._0_4_ * fVar161;
    auVar141._8_4_ = auVar105._8_4_ * fVar193;
    auVar141._12_4_ = auVar105._12_4_ * fVar195;
    auVar141._16_4_ = auVar105._16_4_ * 0.0;
    auVar141._20_4_ = auVar105._20_4_ * 0.0;
    auVar141._24_4_ = auVar105._24_4_ * 0.0;
    auVar141._28_4_ = auVar104._28_4_;
    auVar142._4_4_ = auVar119._4_4_ * fVar191;
    auVar142._0_4_ = auVar119._0_4_ * fVar161;
    auVar142._8_4_ = auVar119._8_4_ * fVar193;
    auVar142._12_4_ = auVar119._12_4_ * fVar195;
    auVar142._16_4_ = auVar119._16_4_ * 0.0;
    auVar142._20_4_ = auVar119._20_4_ * 0.0;
    auVar142._24_4_ = auVar119._24_4_ * 0.0;
    auVar142._28_4_ = auVar105._28_4_;
    auVar5 = vfmadd231ps_fma(auVar251,auVar116,ZEXT1632(auVar95));
    auVar94 = vfmadd231ps_fma(auVar138,auVar116,ZEXT1632(auVar92));
    auVar99 = vfmadd231ps_fma(auVar141,auVar116,ZEXT1632(auVar96));
    auVar95 = vfmadd231ps_fma(auVar142,auVar116,auVar106);
    auVar45._28_4_ = auVar117._28_4_;
    auVar45._0_28_ =
         ZEXT1628(CONCAT412(fVar195 * auVar5._12_4_,
                            CONCAT48(fVar193 * auVar5._8_4_,
                                     CONCAT44(fVar191 * auVar5._4_4_,fVar161 * auVar5._0_4_))));
    auVar92 = vfmadd231ps_fma(auVar45,auVar116,ZEXT1632(auVar91));
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar94._12_4_ * fVar195,
                                             CONCAT48(auVar94._8_4_ * fVar193,
                                                      CONCAT44(auVar94._4_4_ * fVar191,
                                                               auVar94._0_4_ * fVar161)))),auVar116,
                          auVar120);
    auVar123 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar99._12_4_ * fVar195,
                                             CONCAT48(auVar99._8_4_ * fVar193,
                                                      CONCAT44(auVar99._4_4_ * fVar191,
                                                               auVar99._0_4_ * fVar161)))),auVar116,
                          auVar121);
    auVar106 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar95._12_4_ * fVar195,
                                             CONCAT48(auVar95._8_4_ * fVar193,
                                                      CONCAT44(auVar95._4_4_ * fVar191,
                                                               auVar95._0_4_ * fVar161)))),auVar122,
                          auVar116);
    auVar116 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar91));
    auVar117 = vsubps_avx512vl(ZEXT1632(auVar94),auVar120);
    auVar118 = vsubps_avx512vl(ZEXT1632(auVar99),auVar121);
    auVar104 = vsubps_avx512vl(ZEXT1632(auVar95),auVar122);
    auVar260._0_4_ = fVar163 * auVar116._0_4_ * 3.0;
    auVar260._4_4_ = fVar163 * auVar116._4_4_ * 3.0;
    auVar260._8_4_ = fVar163 * auVar116._8_4_ * 3.0;
    auVar260._12_4_ = fVar163 * auVar116._12_4_ * 3.0;
    auVar260._16_4_ = fVar163 * auVar116._16_4_ * 3.0;
    auVar260._20_4_ = fVar163 * auVar116._20_4_ * 3.0;
    auVar260._24_4_ = fVar163 * auVar116._24_4_ * 3.0;
    auVar260._28_4_ = 0;
    auVar261._0_4_ = fVar163 * auVar117._0_4_ * 3.0;
    auVar261._4_4_ = fVar163 * auVar117._4_4_ * 3.0;
    auVar261._8_4_ = fVar163 * auVar117._8_4_ * 3.0;
    auVar261._12_4_ = fVar163 * auVar117._12_4_ * 3.0;
    auVar261._16_4_ = fVar163 * auVar117._16_4_ * 3.0;
    auVar261._20_4_ = fVar163 * auVar117._20_4_ * 3.0;
    auVar261._24_4_ = fVar163 * auVar117._24_4_ * 3.0;
    auVar261._28_4_ = 0;
    auVar46._4_4_ = fVar163 * auVar118._4_4_ * 3.0;
    auVar46._0_4_ = fVar163 * auVar118._0_4_ * 3.0;
    auVar46._8_4_ = fVar163 * auVar118._8_4_ * 3.0;
    auVar46._12_4_ = fVar163 * auVar118._12_4_ * 3.0;
    auVar46._16_4_ = fVar163 * auVar118._16_4_ * 3.0;
    auVar46._20_4_ = fVar163 * auVar118._20_4_ * 3.0;
    auVar46._24_4_ = fVar163 * auVar118._24_4_ * 3.0;
    auVar46._28_4_ = auVar119._28_4_;
    fVar161 = auVar104._0_4_ * 3.0 * fVar163;
    fVar191 = auVar104._4_4_ * 3.0 * fVar163;
    auVar47._4_4_ = fVar191;
    auVar47._0_4_ = fVar161;
    fVar193 = auVar104._8_4_ * 3.0 * fVar163;
    auVar47._8_4_ = fVar193;
    fVar195 = auVar104._12_4_ * 3.0 * fVar163;
    auVar47._12_4_ = fVar195;
    fVar197 = auVar104._16_4_ * 3.0 * fVar163;
    auVar47._16_4_ = fVar197;
    fVar199 = auVar104._20_4_ * 3.0 * fVar163;
    auVar47._20_4_ = fVar199;
    fVar221 = auVar104._24_4_ * 3.0 * fVar163;
    auVar47._24_4_ = fVar221;
    auVar47._28_4_ = fVar163;
    auVar91 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar91);
    auVar119 = vpermt2ps_avx512vl(ZEXT1632(auVar92),_DAT_01feed00,ZEXT1632(auVar91));
    auVar120 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,ZEXT1632(auVar91));
    auVar117 = ZEXT1632(auVar91);
    auVar121 = vpermt2ps_avx512vl(auVar123,_DAT_01feed00,auVar117);
    auVar248._0_4_ = auVar106._0_4_ + fVar161;
    auVar248._4_4_ = auVar106._4_4_ + fVar191;
    auVar248._8_4_ = auVar106._8_4_ + fVar193;
    auVar248._12_4_ = auVar106._12_4_ + fVar195;
    auVar248._16_4_ = auVar106._16_4_ + fVar197;
    auVar248._20_4_ = auVar106._20_4_ + fVar199;
    auVar248._24_4_ = auVar106._24_4_ + fVar221;
    auVar248._28_4_ = auVar106._28_4_ + fVar163;
    auVar116 = vmaxps_avx(auVar106,auVar248);
    auVar122 = vminps_avx512vl(auVar106,auVar248);
    auVar124 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar117);
    auVar125 = vpermt2ps_avx512vl(auVar260,_DAT_01feed00,auVar117);
    auVar126 = vpermt2ps_avx512vl(auVar261,_DAT_01feed00,auVar117);
    auVar137 = ZEXT1632(auVar91);
    auVar127 = vpermt2ps_avx512vl(auVar46,_DAT_01feed00,auVar137);
    auVar106 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar137);
    auVar106 = vsubps_avx(auVar124,auVar106);
    auVar117 = vsubps_avx(auVar119,ZEXT1632(auVar92));
    auVar118 = vsubps_avx(auVar120,auVar105);
    auVar104 = vsubps_avx(auVar121,auVar123);
    auVar128 = vmulps_avx512vl(auVar118,auVar46);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar261,auVar104);
    auVar129 = vmulps_avx512vl(auVar104,auVar260);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar46,auVar117);
    auVar130 = vmulps_avx512vl(auVar117,auVar261);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar260,auVar118);
    auVar130 = vmulps_avx512vl(auVar130,auVar130);
    auVar129 = vfmadd231ps_avx512vl(auVar130,auVar129,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar128);
    auVar129 = vmulps_avx512vl(auVar104,auVar104);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar118,auVar118);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar117,auVar117);
    auVar130 = vrcp14ps_avx512vl(auVar129);
    auVar131 = vfnmadd213ps_avx512vl(auVar130,auVar129,auVar267);
    auVar130 = vfmadd132ps_avx512vl(auVar131,auVar130,auVar130);
    auVar128 = vmulps_avx512vl(auVar128,auVar130);
    auVar131 = vmulps_avx512vl(auVar118,auVar127);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar126,auVar104);
    auVar132 = vmulps_avx512vl(auVar104,auVar125);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar127,auVar117);
    auVar133 = vmulps_avx512vl(auVar117,auVar126);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar125,auVar118);
    auVar133 = vmulps_avx512vl(auVar133,auVar133);
    auVar132 = vfmadd231ps_avx512vl(auVar133,auVar132,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar131,auVar131);
    auVar130 = vmulps_avx512vl(auVar131,auVar130);
    auVar128 = vmaxps_avx512vl(auVar128,auVar130);
    auVar128 = vsqrtps_avx512vl(auVar128);
    auVar130 = vmaxps_avx512vl(auVar106,auVar124);
    auVar116 = vmaxps_avx512vl(auVar116,auVar130);
    auVar130 = vaddps_avx512vl(auVar128,auVar116);
    auVar116 = vminps_avx(auVar106,auVar124);
    auVar116 = vminps_avx512vl(auVar122,auVar116);
    auVar116 = vsubps_avx512vl(auVar116,auVar128);
    auVar133._8_4_ = 0x3f800002;
    auVar133._0_8_ = 0x3f8000023f800002;
    auVar133._12_4_ = 0x3f800002;
    auVar133._16_4_ = 0x3f800002;
    auVar133._20_4_ = 0x3f800002;
    auVar133._24_4_ = 0x3f800002;
    auVar133._28_4_ = 0x3f800002;
    auVar106 = vmulps_avx512vl(auVar130,auVar133);
    auVar134._8_4_ = 0x3f7ffffc;
    auVar134._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar134._12_4_ = 0x3f7ffffc;
    auVar134._16_4_ = 0x3f7ffffc;
    auVar134._20_4_ = 0x3f7ffffc;
    auVar134._24_4_ = 0x3f7ffffc;
    auVar134._28_4_ = 0x3f7ffffc;
    local_a80 = vmulps_avx512vl(auVar116,auVar134);
    auVar116 = vmulps_avx512vl(auVar106,auVar106);
    auVar106 = vrsqrt14ps_avx512vl(auVar129);
    auVar135._8_4_ = 0xbf000000;
    auVar135._0_8_ = 0xbf000000bf000000;
    auVar135._12_4_ = 0xbf000000;
    auVar135._16_4_ = 0xbf000000;
    auVar135._20_4_ = 0xbf000000;
    auVar135._24_4_ = 0xbf000000;
    auVar135._28_4_ = 0xbf000000;
    auVar122 = vmulps_avx512vl(auVar129,auVar135);
    fVar161 = auVar106._0_4_;
    fVar191 = auVar106._4_4_;
    fVar193 = auVar106._8_4_;
    fVar195 = auVar106._12_4_;
    fVar163 = auVar106._16_4_;
    fVar197 = auVar106._20_4_;
    fVar199 = auVar106._24_4_;
    auVar48._4_4_ = fVar191 * fVar191 * fVar191 * auVar122._4_4_;
    auVar48._0_4_ = fVar161 * fVar161 * fVar161 * auVar122._0_4_;
    auVar48._8_4_ = fVar193 * fVar193 * fVar193 * auVar122._8_4_;
    auVar48._12_4_ = fVar195 * fVar195 * fVar195 * auVar122._12_4_;
    auVar48._16_4_ = fVar163 * fVar163 * fVar163 * auVar122._16_4_;
    auVar48._20_4_ = fVar197 * fVar197 * fVar197 * auVar122._20_4_;
    auVar48._24_4_ = fVar199 * fVar199 * fVar199 * auVar122._24_4_;
    auVar48._28_4_ = auVar130._28_4_;
    auVar240._8_4_ = 0x3fc00000;
    auVar240._0_8_ = 0x3fc000003fc00000;
    auVar240._12_4_ = 0x3fc00000;
    auVar240._16_4_ = 0x3fc00000;
    auVar240._20_4_ = 0x3fc00000;
    auVar240._24_4_ = 0x3fc00000;
    auVar240._28_4_ = 0x3fc00000;
    auVar106 = vfmadd231ps_avx512vl(auVar48,auVar106,auVar240);
    auVar122 = vmulps_avx512vl(auVar117,auVar106);
    auVar124 = vmulps_avx512vl(auVar118,auVar106);
    auVar128 = vmulps_avx512vl(auVar104,auVar106);
    auVar240 = ZEXT1632(auVar92);
    auVar129 = vsubps_avx512vl(auVar137,auVar240);
    auVar130 = vsubps_avx512vl(auVar137,auVar105);
    auVar131 = vsubps_avx512vl(auVar137,auVar123);
    auVar132 = vmulps_avx512vl(auVar266._0_32_,auVar131);
    auVar132 = vfmadd231ps_avx512vl(auVar132,local_780,auVar130);
    auVar132 = vfmadd231ps_avx512vl(auVar132,local_760,auVar129);
    auVar133 = vmulps_avx512vl(auVar131,auVar131);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar130,auVar130);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar129,auVar129);
    auVar134 = vmulps_avx512vl(auVar266._0_32_,auVar128);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar124,local_780);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar122,local_760);
    auVar128 = vmulps_avx512vl(auVar131,auVar128);
    auVar124 = vfmadd231ps_avx512vl(auVar128,auVar130,auVar124);
    auVar122 = vfmadd231ps_avx512vl(auVar124,auVar129,auVar122);
    auVar124 = vmulps_avx512vl(auVar134,auVar134);
    auVar128 = vsubps_avx512vl(local_560,auVar124);
    auVar135 = vmulps_avx512vl(auVar134,auVar122);
    auVar132 = vsubps_avx512vl(auVar132,auVar135);
    auVar132 = vaddps_avx512vl(auVar132,auVar132);
    auVar135 = vmulps_avx512vl(auVar122,auVar122);
    auVar133 = vsubps_avx512vl(auVar133,auVar135);
    auVar116 = vsubps_avx512vl(auVar133,auVar116);
    local_7a0 = vmulps_avx512vl(auVar132,auVar132);
    auVar136._8_4_ = 0x40800000;
    auVar136._0_8_ = 0x4080000040800000;
    auVar136._12_4_ = 0x40800000;
    auVar136._16_4_ = 0x40800000;
    auVar136._20_4_ = 0x40800000;
    auVar136._24_4_ = 0x40800000;
    auVar136._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar128,auVar136);
    auVar135 = vmulps_avx512vl(_local_7c0,auVar116);
    auVar135 = vsubps_avx512vl(local_7a0,auVar135);
    uVar88 = vcmpps_avx512vl(auVar135,auVar137,5);
    bVar75 = (byte)uVar88;
    fVar161 = (float)local_9c0._0_4_;
    fVar191 = (float)local_9c0._4_4_;
    fVar193 = fStack_9b8;
    fVar195 = fStack_9b4;
    fVar163 = fStack_9b0;
    fVar197 = fStack_9ac;
    fVar199 = fStack_9a8;
    fVar221 = fStack_9a4;
    if (bVar75 == 0) {
LAB_01ce593e:
      auVar266 = ZEXT3264(local_a00);
      auVar262 = ZEXT3264(local_aa0);
      auVar253 = ZEXT3264(local_860);
      auVar241 = ZEXT3264(local_9e0);
      auVar263 = ZEXT3264(local_ac0);
      auVar264 = ZEXT3264(local_ae0);
      auVar265 = ZEXT3264(local_b00);
    }
    else {
      local_740._0_32_ = auVar133;
      auVar135 = vsqrtps_avx512vl(auVar135);
      auVar136 = vaddps_avx512vl(auVar128,auVar128);
      local_840 = vrcp14ps_avx512vl(auVar136);
      in_ZMM31 = ZEXT3264(local_840);
      auVar137 = vfnmadd213ps_avx512vl(local_840,auVar136,auVar267);
      auVar137 = vfmadd132ps_avx512vl(auVar137,local_840,local_840);
      auVar267._8_4_ = 0x80000000;
      auVar267._0_8_ = 0x8000000080000000;
      auVar267._12_4_ = 0x80000000;
      auVar267._16_4_ = 0x80000000;
      auVar267._20_4_ = 0x80000000;
      auVar267._24_4_ = 0x80000000;
      auVar267._28_4_ = 0x80000000;
      local_9a0 = vxorps_avx512vl(auVar132,auVar267);
      auVar138 = vsubps_avx512vl(local_9a0,auVar135);
      local_a40 = vmulps_avx512vl(auVar138,auVar137);
      auVar135 = vsubps_avx512vl(auVar135,auVar132);
      local_7e0 = vmulps_avx512vl(auVar135,auVar137);
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar137 = vblendmps_avx512vl(auVar135,local_a40);
      auVar139._0_4_ =
           (uint)(bVar75 & 1) * auVar137._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar135._0_4_;
      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar139._4_4_ = (uint)bVar11 * auVar137._4_4_ | (uint)!bVar11 * auVar135._4_4_;
      bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar139._8_4_ = (uint)bVar11 * auVar137._8_4_ | (uint)!bVar11 * auVar135._8_4_;
      bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar139._12_4_ = (uint)bVar11 * auVar137._12_4_ | (uint)!bVar11 * auVar135._12_4_;
      bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
      auVar139._16_4_ = (uint)bVar11 * auVar137._16_4_ | (uint)!bVar11 * auVar135._16_4_;
      bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
      auVar139._20_4_ = (uint)bVar11 * auVar137._20_4_ | (uint)!bVar11 * auVar135._20_4_;
      bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
      auVar139._24_4_ = (uint)bVar11 * auVar137._24_4_ | (uint)!bVar11 * auVar135._24_4_;
      bVar11 = SUB81(uVar88 >> 7,0);
      auVar139._28_4_ = (uint)bVar11 * auVar137._28_4_ | (uint)!bVar11 * auVar135._28_4_;
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar137 = vblendmps_avx512vl(auVar135,local_7e0);
      auVar140._0_4_ =
           (uint)(bVar75 & 1) * auVar137._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar135._0_4_;
      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar140._4_4_ = (uint)bVar11 * auVar137._4_4_ | (uint)!bVar11 * auVar135._4_4_;
      bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar140._8_4_ = (uint)bVar11 * auVar137._8_4_ | (uint)!bVar11 * auVar135._8_4_;
      bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar140._12_4_ = (uint)bVar11 * auVar137._12_4_ | (uint)!bVar11 * auVar135._12_4_;
      bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
      auVar140._16_4_ = (uint)bVar11 * auVar137._16_4_ | (uint)!bVar11 * auVar135._16_4_;
      bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
      auVar140._20_4_ = (uint)bVar11 * auVar137._20_4_ | (uint)!bVar11 * auVar135._20_4_;
      bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
      auVar140._24_4_ = (uint)bVar11 * auVar137._24_4_ | (uint)!bVar11 * auVar135._24_4_;
      bVar11 = SUB81(uVar88 >> 7,0);
      auVar140._28_4_ = (uint)bVar11 * auVar137._28_4_ | (uint)!bVar11 * auVar135._28_4_;
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar124,auVar135);
      local_800 = vmaxps_avx512vl(local_580,auVar135);
      auVar39._8_4_ = 0x36000000;
      auVar39._0_8_ = 0x3600000036000000;
      auVar39._12_4_ = 0x36000000;
      auVar39._16_4_ = 0x36000000;
      auVar39._20_4_ = 0x36000000;
      auVar39._24_4_ = 0x36000000;
      auVar39._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_800,auVar39);
      vandps_avx512vl(auVar128,auVar135);
      uVar79 = vcmpps_avx512vl(local_820,local_820,1);
      uVar88 = uVar88 & uVar79;
      bVar80 = (byte)uVar88;
      if (bVar80 != 0) {
        uVar79 = vcmpps_avx512vl(auVar116,_DAT_01faff00,2);
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar124 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar128 = vblendmps_avx512vl(auVar116,auVar124);
        bVar81 = (byte)uVar79;
        uVar90 = (uint)(bVar81 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar81 & 1) * local_820._0_4_;
        bVar11 = (bool)((byte)(uVar79 >> 1) & 1);
        uVar89 = (uint)bVar11 * auVar128._4_4_ | (uint)!bVar11 * local_820._4_4_;
        bVar11 = (bool)((byte)(uVar79 >> 2) & 1);
        uVar154 = (uint)bVar11 * auVar128._8_4_ | (uint)!bVar11 * local_820._8_4_;
        bVar11 = (bool)((byte)(uVar79 >> 3) & 1);
        uVar155 = (uint)bVar11 * auVar128._12_4_ | (uint)!bVar11 * local_820._12_4_;
        bVar11 = (bool)((byte)(uVar79 >> 4) & 1);
        uVar156 = (uint)bVar11 * auVar128._16_4_ | (uint)!bVar11 * local_820._16_4_;
        bVar11 = (bool)((byte)(uVar79 >> 5) & 1);
        uVar157 = (uint)bVar11 * auVar128._20_4_ | (uint)!bVar11 * local_820._20_4_;
        bVar11 = (bool)((byte)(uVar79 >> 6) & 1);
        uVar158 = (uint)bVar11 * auVar128._24_4_ | (uint)!bVar11 * local_820._24_4_;
        bVar11 = SUB81(uVar79 >> 7,0);
        uVar159 = (uint)bVar11 * auVar128._28_4_ | (uint)!bVar11 * local_820._28_4_;
        auVar139._0_4_ = (bVar80 & 1) * uVar90 | !(bool)(bVar80 & 1) * auVar139._0_4_;
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar139._4_4_ = bVar11 * uVar89 | !bVar11 * auVar139._4_4_;
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar139._8_4_ = bVar11 * uVar154 | !bVar11 * auVar139._8_4_;
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar139._12_4_ = bVar11 * uVar155 | !bVar11 * auVar139._12_4_;
        bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar139._16_4_ = bVar11 * uVar156 | !bVar11 * auVar139._16_4_;
        bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar139._20_4_ = bVar11 * uVar157 | !bVar11 * auVar139._20_4_;
        bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar139._24_4_ = bVar11 * uVar158 | !bVar11 * auVar139._24_4_;
        bVar11 = SUB81(uVar88 >> 7,0);
        auVar139._28_4_ = bVar11 * uVar159 | !bVar11 * auVar139._28_4_;
        auVar116 = vblendmps_avx512vl(auVar124,auVar116);
        bVar11 = (bool)((byte)(uVar79 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar79 >> 6) & 1);
        bVar18 = SUB81(uVar79 >> 7,0);
        auVar140._0_4_ =
             (uint)(bVar80 & 1) *
             ((uint)(bVar81 & 1) * auVar116._0_4_ | !(bool)(bVar81 & 1) * uVar90) |
             !(bool)(bVar80 & 1) * auVar140._0_4_;
        bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar140._4_4_ =
             (uint)bVar12 * ((uint)bVar11 * auVar116._4_4_ | !bVar11 * uVar89) |
             !bVar12 * auVar140._4_4_;
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar140._8_4_ =
             (uint)bVar11 * ((uint)bVar13 * auVar116._8_4_ | !bVar13 * uVar154) |
             !bVar11 * auVar140._8_4_;
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar140._12_4_ =
             (uint)bVar11 * ((uint)bVar14 * auVar116._12_4_ | !bVar14 * uVar155) |
             !bVar11 * auVar140._12_4_;
        bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar140._16_4_ =
             (uint)bVar11 * ((uint)bVar15 * auVar116._16_4_ | !bVar15 * uVar156) |
             !bVar11 * auVar140._16_4_;
        bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar140._20_4_ =
             (uint)bVar11 * ((uint)bVar16 * auVar116._20_4_ | !bVar16 * uVar157) |
             !bVar11 * auVar140._20_4_;
        bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar140._24_4_ =
             (uint)bVar11 * ((uint)bVar17 * auVar116._24_4_ | !bVar17 * uVar158) |
             !bVar11 * auVar140._24_4_;
        bVar11 = SUB81(uVar88 >> 7,0);
        auVar140._28_4_ =
             (uint)bVar11 * ((uint)bVar18 * auVar116._28_4_ | !bVar18 * uVar159) |
             !bVar11 * auVar140._28_4_;
        bVar75 = (~bVar80 | bVar81) & bVar75;
      }
      if ((bVar75 & 0x7f) == 0) {
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar174 = ZEXT3264(auVar116);
        goto LAB_01ce593e;
      }
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar124 = vxorps_avx512vl(auVar127,auVar116);
      auVar125 = vxorps_avx512vl(auVar125,auVar116);
      uVar90 = *(uint *)(ray + k * 4 + 0x200);
      auVar126 = vxorps_avx512vl(auVar126,auVar116);
      auVar91 = vsubss_avx512f(ZEXT416(uVar90),ZEXT416((uint)local_970._0_4_));
      auVar127 = vbroadcastss_avx512vl(auVar91);
      auVar127 = vminps_avx512vl(auVar127,auVar140);
      auVar72._4_4_ = fStack_59c;
      auVar72._0_4_ = local_5a0;
      auVar72._8_4_ = fStack_598;
      auVar72._12_4_ = fStack_594;
      auVar72._16_4_ = fStack_590;
      auVar72._20_4_ = fStack_58c;
      auVar72._24_4_ = fStack_588;
      auVar72._28_4_ = fStack_584;
      auVar128 = vmaxps_avx512vl(auVar72,auVar139);
      auVar131 = vmulps_avx512vl(auVar131,auVar46);
      auVar130 = vfmadd213ps_avx512vl(auVar130,auVar261,auVar131);
      auVar91 = vfmadd213ps_fma(auVar129,auVar260,auVar130);
      in_ZMM31 = ZEXT3264(local_a00);
      auVar129 = vmulps_avx512vl(local_a00,auVar46);
      auVar129 = vfmadd231ps_avx512vl(auVar129,local_780,auVar261);
      auVar129 = vfmadd231ps_avx512vl(auVar129,local_760,auVar260);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar129,auVar130);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar26 = vcmpps_avx512vl(auVar130,auVar131,1);
      auVar135 = vxorps_avx512vl(ZEXT1632(auVar91),auVar116);
      auVar137 = vrcp14ps_avx512vl(auVar129);
      auVar138 = vxorps_avx512vl(auVar129,auVar116);
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar142 = vfnmadd213ps_avx512vl(auVar137,auVar129,auVar141);
      auVar91 = vfmadd132ps_fma(auVar142,auVar137,auVar137);
      fVar175 = auVar91._0_4_ * auVar135._0_4_;
      fVar192 = auVar91._4_4_ * auVar135._4_4_;
      auVar49._4_4_ = fVar192;
      auVar49._0_4_ = fVar175;
      fVar194 = auVar91._8_4_ * auVar135._8_4_;
      auVar49._8_4_ = fVar194;
      fVar196 = auVar91._12_4_ * auVar135._12_4_;
      auVar49._12_4_ = fVar196;
      fVar198 = auVar135._16_4_ * 0.0;
      auVar49._16_4_ = fVar198;
      fVar200 = auVar135._20_4_ * 0.0;
      auVar49._20_4_ = fVar200;
      fVar201 = auVar135._24_4_ * 0.0;
      auVar49._24_4_ = fVar201;
      auVar49._28_4_ = auVar135._28_4_;
      uVar27 = vcmpps_avx512vl(auVar129,auVar138,1);
      bVar80 = (byte)uVar26 | (byte)uVar27;
      auVar258._8_4_ = 0xff800000;
      auVar258._0_8_ = 0xff800000ff800000;
      auVar258._12_4_ = 0xff800000;
      auVar258._16_4_ = 0xff800000;
      auVar258._20_4_ = 0xff800000;
      auVar258._24_4_ = 0xff800000;
      auVar258._28_4_ = 0xff800000;
      auVar142 = vblendmps_avx512vl(auVar49,auVar258);
      auVar143._0_4_ =
           (uint)(bVar80 & 1) * auVar142._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar137._0_4_;
      bVar11 = (bool)(bVar80 >> 1 & 1);
      auVar143._4_4_ = (uint)bVar11 * auVar142._4_4_ | (uint)!bVar11 * auVar137._4_4_;
      bVar11 = (bool)(bVar80 >> 2 & 1);
      auVar143._8_4_ = (uint)bVar11 * auVar142._8_4_ | (uint)!bVar11 * auVar137._8_4_;
      bVar11 = (bool)(bVar80 >> 3 & 1);
      auVar143._12_4_ = (uint)bVar11 * auVar142._12_4_ | (uint)!bVar11 * auVar137._12_4_;
      bVar11 = (bool)(bVar80 >> 4 & 1);
      auVar143._16_4_ = (uint)bVar11 * auVar142._16_4_ | (uint)!bVar11 * auVar137._16_4_;
      bVar11 = (bool)(bVar80 >> 5 & 1);
      auVar143._20_4_ = (uint)bVar11 * auVar142._20_4_ | (uint)!bVar11 * auVar137._20_4_;
      bVar11 = (bool)(bVar80 >> 6 & 1);
      auVar143._24_4_ = (uint)bVar11 * auVar142._24_4_ | (uint)!bVar11 * auVar137._24_4_;
      auVar143._28_4_ =
           (uint)(bVar80 >> 7) * auVar142._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar137._28_4_;
      auVar137 = vmaxps_avx512vl(auVar128,auVar143);
      uVar27 = vcmpps_avx512vl(auVar129,auVar138,6);
      bVar80 = (byte)uVar26 | (byte)uVar27;
      auVar144._0_4_ = (uint)(bVar80 & 1) * 0x7f800000 | (uint)!(bool)(bVar80 & 1) * (int)fVar175;
      bVar11 = (bool)(bVar80 >> 1 & 1);
      auVar144._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar192;
      bVar11 = (bool)(bVar80 >> 2 & 1);
      auVar144._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar194;
      bVar11 = (bool)(bVar80 >> 3 & 1);
      auVar144._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar196;
      bVar11 = (bool)(bVar80 >> 4 & 1);
      auVar144._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar198;
      bVar11 = (bool)(bVar80 >> 5 & 1);
      auVar144._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar200;
      bVar11 = (bool)(bVar80 >> 6 & 1);
      auVar144._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar201;
      auVar144._28_4_ =
           (uint)(bVar80 >> 7) * 0x7f800000 | (uint)!(bool)(bVar80 >> 7) * auVar135._28_4_;
      auVar127 = vminps_avx512vl(auVar127,auVar144);
      auVar91 = vxorps_avx512vl(auVar128._0_16_,auVar128._0_16_);
      auVar119 = vsubps_avx512vl(ZEXT1632(auVar91),auVar119);
      auVar120 = vsubps_avx512vl(ZEXT1632(auVar91),auVar120);
      auVar128 = ZEXT1632(auVar91);
      auVar121 = vsubps_avx512vl(auVar128,auVar121);
      auVar121 = vmulps_avx512vl(auVar121,auVar124);
      auVar120 = vfmadd231ps_avx512vl(auVar121,auVar126,auVar120);
      auVar119 = vfmadd231ps_avx512vl(auVar120,auVar125,auVar119);
      auVar120 = vmulps_avx512vl(local_a00,auVar124);
      auVar120 = vfmadd231ps_avx512vl(auVar120,local_780,auVar126);
      auVar120 = vfmadd231ps_avx512vl(auVar120,local_760,auVar125);
      vandps_avx512vl(auVar120,auVar130);
      uVar26 = vcmpps_avx512vl(auVar120,auVar131,1);
      auVar119 = vxorps_avx512vl(auVar119,auVar116);
      auVar121 = vrcp14ps_avx512vl(auVar120);
      auVar116 = vxorps_avx512vl(auVar120,auVar116);
      auVar124 = vfnmadd213ps_avx512vl(auVar121,auVar120,auVar141);
      auVar91 = vfmadd132ps_fma(auVar124,auVar121,auVar121);
      fVar175 = auVar91._0_4_ * auVar119._0_4_;
      fVar192 = auVar91._4_4_ * auVar119._4_4_;
      auVar50._4_4_ = fVar192;
      auVar50._0_4_ = fVar175;
      fVar194 = auVar91._8_4_ * auVar119._8_4_;
      auVar50._8_4_ = fVar194;
      fVar196 = auVar91._12_4_ * auVar119._12_4_;
      auVar50._12_4_ = fVar196;
      fVar198 = auVar119._16_4_ * 0.0;
      auVar50._16_4_ = fVar198;
      fVar200 = auVar119._20_4_ * 0.0;
      auVar50._20_4_ = fVar200;
      fVar201 = auVar119._24_4_ * 0.0;
      auVar50._24_4_ = fVar201;
      auVar50._28_4_ = auVar119._28_4_;
      uVar27 = vcmpps_avx512vl(auVar120,auVar116,1);
      bVar80 = (byte)uVar26 | (byte)uVar27;
      auVar124 = vblendmps_avx512vl(auVar50,auVar258);
      auVar145._0_4_ =
           (uint)(bVar80 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar121._0_4_;
      bVar11 = (bool)(bVar80 >> 1 & 1);
      auVar145._4_4_ = (uint)bVar11 * auVar124._4_4_ | (uint)!bVar11 * auVar121._4_4_;
      bVar11 = (bool)(bVar80 >> 2 & 1);
      auVar145._8_4_ = (uint)bVar11 * auVar124._8_4_ | (uint)!bVar11 * auVar121._8_4_;
      bVar11 = (bool)(bVar80 >> 3 & 1);
      auVar145._12_4_ = (uint)bVar11 * auVar124._12_4_ | (uint)!bVar11 * auVar121._12_4_;
      bVar11 = (bool)(bVar80 >> 4 & 1);
      auVar145._16_4_ = (uint)bVar11 * auVar124._16_4_ | (uint)!bVar11 * auVar121._16_4_;
      bVar11 = (bool)(bVar80 >> 5 & 1);
      auVar145._20_4_ = (uint)bVar11 * auVar124._20_4_ | (uint)!bVar11 * auVar121._20_4_;
      bVar11 = (bool)(bVar80 >> 6 & 1);
      auVar145._24_4_ = (uint)bVar11 * auVar124._24_4_ | (uint)!bVar11 * auVar121._24_4_;
      auVar145._28_4_ =
           (uint)(bVar80 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar121._28_4_;
      _local_900 = vmaxps_avx(auVar137,auVar145);
      uVar27 = vcmpps_avx512vl(auVar120,auVar116,6);
      bVar80 = (byte)uVar26 | (byte)uVar27;
      auVar146._0_4_ = (uint)(bVar80 & 1) * 0x7f800000 | (uint)!(bool)(bVar80 & 1) * (int)fVar175;
      bVar11 = (bool)(bVar80 >> 1 & 1);
      auVar146._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar192;
      bVar11 = (bool)(bVar80 >> 2 & 1);
      auVar146._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar194;
      bVar11 = (bool)(bVar80 >> 3 & 1);
      auVar146._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar196;
      bVar11 = (bool)(bVar80 >> 4 & 1);
      auVar146._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar198;
      bVar11 = (bool)(bVar80 >> 5 & 1);
      auVar146._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar200;
      bVar11 = (bool)(bVar80 >> 6 & 1);
      auVar146._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar201;
      auVar146._28_4_ =
           (uint)(bVar80 >> 7) * 0x7f800000 | (uint)!(bool)(bVar80 >> 7) * auVar119._28_4_;
      local_620 = vminps_avx(auVar127,auVar146);
      uVar26 = vcmpps_avx512vl(_local_900,local_620,2);
      bVar75 = bVar75 & 0x7f & (byte)uVar26;
      if (bVar75 == 0) {
        auVar174 = ZEXT3264(auVar141);
        goto LAB_01ce593e;
      }
      auVar119 = vmaxps_avx512vl(auVar128,local_a80);
      auVar116 = vfmadd213ps_avx512vl(local_a40,auVar134,auVar122);
      fVar175 = auVar106._0_4_;
      fVar192 = auVar106._4_4_;
      auVar51._4_4_ = fVar192 * auVar116._4_4_;
      auVar51._0_4_ = fVar175 * auVar116._0_4_;
      fVar194 = auVar106._8_4_;
      auVar51._8_4_ = fVar194 * auVar116._8_4_;
      fVar196 = auVar106._12_4_;
      auVar51._12_4_ = fVar196 * auVar116._12_4_;
      fVar198 = auVar106._16_4_;
      auVar51._16_4_ = fVar198 * auVar116._16_4_;
      fVar200 = auVar106._20_4_;
      auVar51._20_4_ = fVar200 * auVar116._20_4_;
      fVar201 = auVar106._24_4_;
      auVar51._24_4_ = fVar201 * auVar116._24_4_;
      auVar51._28_4_ = auVar116._28_4_;
      auVar116 = vfmadd213ps_avx512vl(local_7e0,auVar134,auVar122);
      auVar52._4_4_ = fVar192 * auVar116._4_4_;
      auVar52._0_4_ = fVar175 * auVar116._0_4_;
      auVar52._8_4_ = fVar194 * auVar116._8_4_;
      auVar52._12_4_ = fVar196 * auVar116._12_4_;
      auVar52._16_4_ = fVar198 * auVar116._16_4_;
      auVar52._20_4_ = fVar200 * auVar116._20_4_;
      auVar52._24_4_ = fVar201 * auVar116._24_4_;
      auVar52._28_4_ = auVar145._28_4_;
      auVar116 = vminps_avx512vl(auVar51,auVar141);
      auVar120 = ZEXT832(0) << 0x20;
      auVar116 = vmaxps_avx(auVar116,ZEXT832(0) << 0x20);
      auVar121 = vminps_avx512vl(auVar52,auVar141);
      auVar53._4_4_ = (auVar116._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar116._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar116._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar116._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar116._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar116._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar116._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar116._28_4_ + 7.0;
      auVar91 = vfmadd213ps_fma(auVar53,auVar247,auVar235);
      local_4e0 = ZEXT1632(auVar91);
      auVar116 = vmaxps_avx(auVar121,ZEXT832(0) << 0x20);
      auVar54._4_4_ = (auVar116._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar116._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar116._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar116._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar116._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar116._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar116._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar116._28_4_ + 7.0;
      auVar91 = vfmadd213ps_fma(auVar54,auVar247,auVar235);
      local_500 = ZEXT1632(auVar91);
      auVar55._4_4_ = auVar119._4_4_ * auVar119._4_4_;
      auVar55._0_4_ = auVar119._0_4_ * auVar119._0_4_;
      auVar55._8_4_ = auVar119._8_4_ * auVar119._8_4_;
      auVar55._12_4_ = auVar119._12_4_ * auVar119._12_4_;
      auVar55._16_4_ = auVar119._16_4_ * auVar119._16_4_;
      auVar55._20_4_ = auVar119._20_4_ * auVar119._20_4_;
      auVar55._24_4_ = auVar119._24_4_ * auVar119._24_4_;
      auVar55._28_4_ = auVar119._28_4_;
      auVar116 = vsubps_avx(auVar133,auVar55);
      auVar56._4_4_ = auVar116._4_4_ * (float)local_7c0._4_4_;
      auVar56._0_4_ = auVar116._0_4_ * (float)local_7c0._0_4_;
      auVar56._8_4_ = auVar116._8_4_ * fStack_7b8;
      auVar56._12_4_ = auVar116._12_4_ * fStack_7b4;
      auVar56._16_4_ = auVar116._16_4_ * fStack_7b0;
      auVar56._20_4_ = auVar116._20_4_ * fStack_7ac;
      auVar56._24_4_ = auVar116._24_4_ * fStack_7a8;
      auVar56._28_4_ = auVar119._28_4_;
      auVar119 = vsubps_avx(local_7a0,auVar56);
      uVar26 = vcmpps_avx512vl(auVar119,ZEXT832(0) << 0x20,5);
      bVar80 = (byte)uVar26;
      auVar265 = ZEXT3264(local_b00);
      if (bVar80 == 0) {
        bVar80 = 0;
        auVar106 = ZEXT832(0) << 0x20;
        auVar117 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar121 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar124 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar119 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar147._8_4_ = 0x7f800000;
        auVar147._0_8_ = 0x7f8000007f800000;
        auVar147._12_4_ = 0x7f800000;
        auVar147._16_4_ = 0x7f800000;
        auVar147._20_4_ = 0x7f800000;
        auVar147._24_4_ = 0x7f800000;
        auVar147._28_4_ = 0x7f800000;
        auVar148._8_4_ = 0xff800000;
        auVar148._0_8_ = 0xff800000ff800000;
        auVar148._12_4_ = 0xff800000;
        auVar148._16_4_ = 0xff800000;
        auVar148._20_4_ = 0xff800000;
        auVar148._24_4_ = 0xff800000;
        auVar148._28_4_ = 0xff800000;
      }
      else {
        uVar88 = vcmpps_avx512vl(auVar119,auVar128,5);
        auVar119 = vsqrtps_avx(auVar119);
        auVar120 = vfnmadd213ps_avx512vl(auVar136,local_840,auVar141);
        auVar124 = vfmadd132ps_avx512vl(auVar120,local_840,local_840);
        auVar120 = vsubps_avx(local_9a0,auVar119);
        auVar125 = vmulps_avx512vl(auVar120,auVar124);
        auVar119 = vsubps_avx512vl(auVar119,auVar132);
        auVar126 = vmulps_avx512vl(auVar119,auVar124);
        auVar119 = vfmadd213ps_avx512vl(auVar134,auVar125,auVar122);
        auVar57._4_4_ = fVar192 * auVar119._4_4_;
        auVar57._0_4_ = fVar175 * auVar119._0_4_;
        auVar57._8_4_ = fVar194 * auVar119._8_4_;
        auVar57._12_4_ = fVar196 * auVar119._12_4_;
        auVar57._16_4_ = fVar198 * auVar119._16_4_;
        auVar57._20_4_ = fVar200 * auVar119._20_4_;
        auVar57._24_4_ = fVar201 * auVar119._24_4_;
        auVar57._28_4_ = auVar121._28_4_;
        auVar119 = vmulps_avx512vl(local_760,auVar125);
        auVar120 = vmulps_avx512vl(local_780,auVar125);
        auVar127 = vmulps_avx512vl(local_a00,auVar125);
        auVar121 = vfmadd213ps_avx512vl(auVar117,auVar57,auVar240);
        auVar121 = vsubps_avx512vl(auVar119,auVar121);
        auVar119 = vfmadd213ps_avx512vl(auVar118,auVar57,auVar105);
        auVar124 = vsubps_avx512vl(auVar120,auVar119);
        auVar91 = vfmadd213ps_fma(auVar57,auVar104,auVar123);
        auVar119 = vsubps_avx(auVar127,ZEXT1632(auVar91));
        auVar120 = vfmadd213ps_avx512vl(auVar134,auVar126,auVar122);
        auVar122 = vmulps_avx512vl(auVar106,auVar120);
        auVar106 = vmulps_avx512vl(local_760,auVar126);
        auVar127 = vmulps_avx512vl(local_780,auVar126);
        auVar128 = vmulps_avx512vl(local_a00,auVar126);
        auVar91 = vfmadd213ps_fma(auVar117,auVar122,auVar240);
        auVar120 = vsubps_avx(auVar106,ZEXT1632(auVar91));
        auVar91 = vfmadd213ps_fma(auVar118,auVar122,auVar105);
        auVar106 = vsubps_avx512vl(auVar127,ZEXT1632(auVar91));
        auVar91 = vfmadd213ps_fma(auVar104,auVar122,auVar123);
        auVar117 = vsubps_avx512vl(auVar128,ZEXT1632(auVar91));
        auVar215._8_4_ = 0x7f800000;
        auVar215._0_8_ = 0x7f8000007f800000;
        auVar215._12_4_ = 0x7f800000;
        auVar215._16_4_ = 0x7f800000;
        auVar215._20_4_ = 0x7f800000;
        auVar215._24_4_ = 0x7f800000;
        auVar215._28_4_ = 0x7f800000;
        auVar118 = vblendmps_avx512vl(auVar215,auVar125);
        bVar11 = (bool)((byte)uVar88 & 1);
        auVar147._0_4_ = (uint)bVar11 * auVar118._0_4_ | (uint)!bVar11 * auVar92._0_4_;
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar147._4_4_ = (uint)bVar11 * auVar118._4_4_ | (uint)!bVar11 * auVar92._4_4_;
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar147._8_4_ = (uint)bVar11 * auVar118._8_4_ | (uint)!bVar11 * auVar92._8_4_;
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar147._12_4_ = (uint)bVar11 * auVar118._12_4_ | (uint)!bVar11 * auVar92._12_4_;
        iVar1 = (uint)((byte)(uVar88 >> 4) & 1) * auVar118._16_4_;
        auVar147._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar88 >> 5) & 1) * auVar118._20_4_;
        auVar147._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar88 >> 6) & 1) * auVar118._24_4_;
        auVar147._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar88 >> 7) * auVar118._28_4_;
        auVar147._28_4_ = iVar4;
        auVar216._8_4_ = 0xff800000;
        auVar216._0_8_ = 0xff800000ff800000;
        auVar216._12_4_ = 0xff800000;
        auVar216._16_4_ = 0xff800000;
        auVar216._20_4_ = 0xff800000;
        auVar216._24_4_ = 0xff800000;
        auVar216._28_4_ = 0xff800000;
        auVar118 = vblendmps_avx512vl(auVar216,auVar126);
        bVar11 = (bool)((byte)uVar88 & 1);
        auVar148._0_4_ = (uint)bVar11 * auVar118._0_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar148._4_4_ = (uint)bVar11 * auVar118._4_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar148._8_4_ = (uint)bVar11 * auVar118._8_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar148._12_4_ = (uint)bVar11 * auVar118._12_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar148._16_4_ = (uint)bVar11 * auVar118._16_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar148._20_4_ = (uint)bVar11 * auVar118._20_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar148._24_4_ = (uint)bVar11 * auVar118._24_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = SUB81(uVar88 >> 7,0);
        auVar148._28_4_ = (uint)bVar11 * auVar118._28_4_ | (uint)!bVar11 * -0x800000;
        auVar40._8_4_ = 0x36000000;
        auVar40._0_8_ = 0x3600000036000000;
        auVar40._12_4_ = 0x36000000;
        auVar40._16_4_ = 0x36000000;
        auVar40._20_4_ = 0x36000000;
        auVar40._24_4_ = 0x36000000;
        auVar40._28_4_ = 0x36000000;
        auVar118 = vmulps_avx512vl(local_800,auVar40);
        uVar79 = vcmpps_avx512vl(auVar118,local_820,0xe);
        uVar88 = uVar88 & uVar79;
        bVar81 = (byte)uVar88;
        if (bVar81 != 0) {
          uVar79 = vcmpps_avx512vl(auVar116,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar256._8_4_ = 0x7f800000;
          auVar256._0_8_ = 0x7f8000007f800000;
          auVar256._12_4_ = 0x7f800000;
          auVar256._16_4_ = 0x7f800000;
          auVar256._20_4_ = 0x7f800000;
          auVar256._24_4_ = 0x7f800000;
          auVar256._28_4_ = 0x7f800000;
          auVar259._8_4_ = 0xff800000;
          auVar259._0_8_ = 0xff800000ff800000;
          auVar259._12_4_ = 0xff800000;
          auVar259._16_4_ = 0xff800000;
          auVar259._20_4_ = 0xff800000;
          auVar259._24_4_ = 0xff800000;
          auVar259._28_4_ = 0xff800000;
          auVar116 = vblendmps_avx512vl(auVar256,auVar259);
          bVar85 = (byte)uVar79;
          uVar89 = (uint)(bVar85 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar118._0_4_;
          bVar11 = (bool)((byte)(uVar79 >> 1) & 1);
          uVar154 = (uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * auVar118._4_4_;
          bVar11 = (bool)((byte)(uVar79 >> 2) & 1);
          uVar155 = (uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * auVar118._8_4_;
          bVar11 = (bool)((byte)(uVar79 >> 3) & 1);
          uVar156 = (uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * auVar118._12_4_;
          bVar11 = (bool)((byte)(uVar79 >> 4) & 1);
          uVar157 = (uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * auVar118._16_4_;
          bVar11 = (bool)((byte)(uVar79 >> 5) & 1);
          uVar158 = (uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * auVar118._20_4_;
          bVar11 = (bool)((byte)(uVar79 >> 6) & 1);
          uVar159 = (uint)bVar11 * auVar116._24_4_ | (uint)!bVar11 * auVar118._24_4_;
          bVar11 = SUB81(uVar79 >> 7,0);
          uVar160 = (uint)bVar11 * auVar116._28_4_ | (uint)!bVar11 * auVar118._28_4_;
          auVar147._0_4_ = (bVar81 & 1) * uVar89 | !(bool)(bVar81 & 1) * auVar147._0_4_;
          bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar147._4_4_ = bVar11 * uVar154 | !bVar11 * auVar147._4_4_;
          bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar147._8_4_ = bVar11 * uVar155 | !bVar11 * auVar147._8_4_;
          bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar147._12_4_ = bVar11 * uVar156 | !bVar11 * auVar147._12_4_;
          bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar147._16_4_ = bVar11 * uVar157 | (uint)!bVar11 * iVar1;
          bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar147._20_4_ = bVar11 * uVar158 | (uint)!bVar11 * iVar2;
          bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar147._24_4_ = bVar11 * uVar159 | (uint)!bVar11 * iVar3;
          bVar11 = SUB81(uVar88 >> 7,0);
          auVar147._28_4_ = bVar11 * uVar160 | (uint)!bVar11 * iVar4;
          auVar116 = vblendmps_avx512vl(auVar259,auVar256);
          bVar11 = (bool)((byte)(uVar79 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar79 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar79 >> 6) & 1);
          bVar18 = SUB81(uVar79 >> 7,0);
          auVar148._0_4_ =
               (uint)(bVar81 & 1) *
               ((uint)(bVar85 & 1) * auVar116._0_4_ | !(bool)(bVar85 & 1) * uVar89) |
               !(bool)(bVar81 & 1) * auVar148._0_4_;
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar148._4_4_ =
               (uint)bVar12 * ((uint)bVar11 * auVar116._4_4_ | !bVar11 * uVar154) |
               !bVar12 * auVar148._4_4_;
          bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar148._8_4_ =
               (uint)bVar11 * ((uint)bVar13 * auVar116._8_4_ | !bVar13 * uVar155) |
               !bVar11 * auVar148._8_4_;
          bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar148._12_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar116._12_4_ | !bVar14 * uVar156) |
               !bVar11 * auVar148._12_4_;
          bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar148._16_4_ =
               (uint)bVar11 * ((uint)bVar15 * auVar116._16_4_ | !bVar15 * uVar157) |
               !bVar11 * auVar148._16_4_;
          bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar148._20_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar116._20_4_ | !bVar16 * uVar158) |
               !bVar11 * auVar148._20_4_;
          bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar148._24_4_ =
               (uint)bVar11 * ((uint)bVar17 * auVar116._24_4_ | !bVar17 * uVar159) |
               !bVar11 * auVar148._24_4_;
          bVar11 = SUB81(uVar88 >> 7,0);
          auVar148._28_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar116._28_4_ | !bVar18 * uVar160) |
               !bVar11 * auVar148._28_4_;
          bVar80 = (~bVar81 | bVar85) & bVar80;
        }
      }
      auVar266 = ZEXT3264(local_a00);
      auVar116 = vmulps_avx512vl(local_a00,auVar117);
      auVar91 = vfmadd231ps_fma(auVar116,local_780,auVar106);
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_760,auVar120);
      _local_540 = _local_900;
      local_520 = vminps_avx(local_620,auVar147);
      auVar252._8_4_ = 0x7fffffff;
      auVar252._0_8_ = 0x7fffffff7fffffff;
      auVar252._12_4_ = 0x7fffffff;
      auVar252._16_4_ = 0x7fffffff;
      auVar252._20_4_ = 0x7fffffff;
      auVar252._24_4_ = 0x7fffffff;
      auVar252._28_4_ = 0x7fffffff;
      auVar116 = vandps_avx(ZEXT1632(auVar91),auVar252);
      auVar106 = vmaxps_avx(_local_900,auVar148);
      auVar218._8_4_ = 0x3e99999a;
      auVar218._0_8_ = 0x3e99999a3e99999a;
      auVar218._12_4_ = 0x3e99999a;
      auVar218._16_4_ = 0x3e99999a;
      auVar218._20_4_ = 0x3e99999a;
      auVar218._24_4_ = 0x3e99999a;
      auVar218._28_4_ = 0x3e99999a;
      uVar26 = vcmpps_avx512vl(auVar116,auVar218,1);
      local_6c0._0_2_ = (short)uVar26;
      uVar26 = vcmpps_avx512vl(_local_900,local_520,2);
      bVar81 = (byte)uVar26 & bVar75;
      uVar27 = vcmpps_avx512vl(auVar106,local_620,2);
      auVar262 = ZEXT3264(local_aa0);
      auVar263 = ZEXT3264(local_ac0);
      auVar264 = ZEXT3264(local_ae0);
      if ((bVar75 & ((byte)uVar27 | (byte)uVar26)) == 0) {
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar174 = ZEXT3264(auVar116);
        auVar253 = ZEXT3264(local_860);
        auVar241 = ZEXT3264(local_9e0);
      }
      else {
        auVar116 = vmulps_avx512vl(local_a00,auVar119);
        auVar91 = vfmadd213ps_fma(auVar124,local_780,auVar116);
        auVar91 = vfmadd213ps_fma(auVar121,local_760,ZEXT1632(auVar91));
        auVar116 = vandps_avx(ZEXT1632(auVar91),auVar252);
        uVar26 = vcmpps_avx512vl(auVar116,auVar218,1);
        bVar85 = (byte)uVar26 | ~bVar80;
        auVar170._8_4_ = 2;
        auVar170._0_8_ = 0x200000002;
        auVar170._12_4_ = 2;
        auVar170._16_4_ = 2;
        auVar170._20_4_ = 2;
        auVar170._24_4_ = 2;
        auVar170._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar116 = vpblendmd_avx512vl(auVar170,auVar41);
        local_5e0._0_4_ = (uint)(bVar85 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar85 & 1) * 2;
        bVar11 = (bool)(bVar85 >> 1 & 1);
        local_5e0._4_4_ = (uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar85 >> 2 & 1);
        local_5e0._8_4_ = (uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar85 >> 3 & 1);
        local_5e0._12_4_ = (uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar85 >> 4 & 1);
        local_5e0._16_4_ = (uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar85 >> 5 & 1);
        local_5e0._20_4_ = (uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar85 >> 6 & 1);
        local_5e0._24_4_ = (uint)bVar11 * auVar116._24_4_ | (uint)!bVar11 * 2;
        local_5e0._28_4_ = (uint)(bVar85 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar85 >> 7) * 2;
        local_660 = vpbroadcastd_avx512vl();
        uVar26 = vpcmpd_avx512vl(local_660,local_5e0,5);
        bVar85 = (byte)uVar26 & bVar81;
        local_640 = auVar106;
        if (bVar85 == 0) {
          auVar172._4_4_ = uVar90;
          auVar172._0_4_ = uVar90;
          auVar172._8_4_ = uVar90;
          auVar172._12_4_ = uVar90;
          auVar172._16_4_ = uVar90;
          auVar172._20_4_ = uVar90;
          auVar172._24_4_ = uVar90;
          auVar172._28_4_ = uVar90;
        }
        else {
          local_600 = auVar106;
          auVar5 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar91 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar94 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar99 = vminps_avx(auVar5,auVar94);
          auVar5 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar94 = vmaxps_avx(auVar91,auVar5);
          auVar103._8_4_ = 0x7fffffff;
          auVar103._0_8_ = 0x7fffffff7fffffff;
          auVar103._12_4_ = 0x7fffffff;
          auVar91 = vandps_avx(auVar99,auVar103);
          auVar5 = vandps_avx(auVar94,auVar103);
          auVar91 = vmaxps_avx(auVar91,auVar5);
          auVar5 = vmovshdup_avx(auVar91);
          auVar5 = vmaxss_avx(auVar5,auVar91);
          auVar91 = vshufpd_avx(auVar91,auVar91,1);
          auVar91 = vmaxss_avx(auVar91,auVar5);
          fVar161 = auVar91._0_4_ * 1.9073486e-06;
          local_960 = vshufps_avx(auVar94,auVar94,0xff);
          local_6a0 = (float)local_9c0._0_4_ + (float)local_900._0_4_;
          fStack_69c = (float)local_9c0._4_4_ + (float)local_900._4_4_;
          fStack_698 = fStack_9b8 + fStack_8f8;
          fStack_694 = fStack_9b4 + fStack_8f4;
          fStack_690 = fStack_9b0 + fStack_8f0;
          fStack_68c = fStack_9ac + fStack_8ec;
          fStack_688 = fStack_9a8 + fStack_8e8;
          fStack_684 = fStack_9a4 + fStack_8e4;
          do {
            auVar171._8_4_ = 0x7f800000;
            auVar171._0_8_ = 0x7f8000007f800000;
            auVar171._12_4_ = 0x7f800000;
            auVar171._16_4_ = 0x7f800000;
            auVar171._20_4_ = 0x7f800000;
            auVar171._24_4_ = 0x7f800000;
            auVar171._28_4_ = 0x7f800000;
            auVar116 = vblendmps_avx512vl(auVar171,_local_900);
            auVar150._0_4_ =
                 (uint)(bVar85 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar85 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar85 >> 1 & 1);
            auVar150._4_4_ = (uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar85 >> 2 & 1);
            auVar150._8_4_ = (uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar85 >> 3 & 1);
            auVar150._12_4_ = (uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar85 >> 4 & 1);
            auVar150._16_4_ = (uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar85 >> 5 & 1);
            auVar150._20_4_ = (uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * 0x7f800000;
            auVar150._24_4_ =
                 (uint)(bVar85 >> 6) * auVar116._24_4_ | (uint)!(bool)(bVar85 >> 6) * 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar116 = vshufps_avx(auVar150,auVar150,0xb1);
            auVar116 = vminps_avx(auVar150,auVar116);
            auVar106 = vshufpd_avx(auVar116,auVar116,5);
            auVar116 = vminps_avx(auVar116,auVar106);
            auVar106 = vpermpd_avx2(auVar116,0x4e);
            auVar116 = vminps_avx(auVar116,auVar106);
            uVar26 = vcmpps_avx512vl(auVar150,auVar116,0);
            bVar76 = (byte)uVar26 & bVar85;
            bVar77 = bVar85;
            if (bVar76 != 0) {
              bVar77 = bVar76;
            }
            iVar2 = 0;
            for (uVar90 = (uint)bVar77; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar90 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
            fVar191 = auVar25._0_4_;
            auVar91 = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
              fVar191 = sqrtf((float)local_a20._0_4_);
              auVar91 = local_a80._0_16_;
            }
            auVar91 = vinsertps_avx(auVar91,ZEXT416(uVar90),0x10);
            auVar174 = ZEXT1664(auVar91);
            lVar84 = 5;
            do {
              uVar162 = auVar174._0_4_;
              auVar164._4_4_ = uVar162;
              auVar164._0_4_ = uVar162;
              auVar164._8_4_ = uVar162;
              auVar164._12_4_ = uVar162;
              auVar5 = vfmadd132ps_fma(auVar164,ZEXT816(0) << 0x40,local_a10);
              auVar94 = auVar174._0_16_;
              auVar91 = vmovshdup_avx(auVar94);
              local_7e0._0_16_ = auVar91;
              fVar199 = 1.0 - auVar91._0_4_;
              auVar91 = vshufps_avx(auVar94,auVar94,0x55);
              fVar193 = auVar91._0_4_;
              auVar202._0_4_ = local_8c0._0_4_ * fVar193;
              fVar195 = auVar91._4_4_;
              auVar202._4_4_ = local_8c0._4_4_ * fVar195;
              fVar163 = auVar91._8_4_;
              auVar202._8_4_ = local_8c0._8_4_ * fVar163;
              fVar197 = auVar91._12_4_;
              auVar202._12_4_ = local_8c0._12_4_ * fVar197;
              _local_7c0 = ZEXT416((uint)fVar199);
              auVar223._4_4_ = fVar199;
              auVar223._0_4_ = fVar199;
              auVar223._8_4_ = fVar199;
              auVar223._12_4_ = fVar199;
              auVar91 = vfmadd231ps_fma(auVar202,auVar223,local_880._0_16_);
              auVar236._0_4_ = local_8a0._0_4_ * fVar193;
              auVar236._4_4_ = local_8a0._4_4_ * fVar195;
              auVar236._8_4_ = local_8a0._8_4_ * fVar163;
              auVar236._12_4_ = local_8a0._12_4_ * fVar197;
              auVar94 = vfmadd231ps_fma(auVar236,auVar223,local_8c0._0_16_);
              auVar243._0_4_ = fVar193 * (float)local_8e0._0_4_;
              auVar243._4_4_ = fVar195 * (float)local_8e0._4_4_;
              auVar243._8_4_ = fVar163 * fStack_8d8;
              auVar243._12_4_ = fVar197 * fStack_8d4;
              auVar99 = vfmadd231ps_fma(auVar243,auVar223,local_8a0._0_16_);
              auVar249._0_4_ = fVar193 * auVar94._0_4_;
              auVar249._4_4_ = fVar195 * auVar94._4_4_;
              auVar249._8_4_ = fVar163 * auVar94._8_4_;
              auVar249._12_4_ = fVar197 * auVar94._12_4_;
              auVar91 = vfmadd231ps_fma(auVar249,auVar223,auVar91);
              auVar203._0_4_ = fVar193 * auVar99._0_4_;
              auVar203._4_4_ = fVar195 * auVar99._4_4_;
              auVar203._8_4_ = fVar163 * auVar99._8_4_;
              auVar203._12_4_ = fVar197 * auVar99._12_4_;
              auVar94 = vfmadd231ps_fma(auVar203,auVar223,auVar94);
              auVar237._0_4_ = fVar193 * auVar94._0_4_;
              auVar237._4_4_ = fVar195 * auVar94._4_4_;
              auVar237._8_4_ = fVar163 * auVar94._8_4_;
              auVar237._12_4_ = fVar197 * auVar94._12_4_;
              auVar99 = vfmadd231ps_fma(auVar237,auVar91,auVar223);
              auVar91 = vsubps_avx(auVar94,auVar91);
              auVar29._8_4_ = 0x40400000;
              auVar29._0_8_ = 0x4040000040400000;
              auVar29._12_4_ = 0x40400000;
              auVar94 = vmulps_avx512vl(auVar91,auVar29);
              local_7a0._0_16_ = auVar99;
              auVar5 = vsubps_avx(auVar5,auVar99);
              auVar91 = vdpps_avx(auVar5,auVar5,0x7f);
              local_a80._0_16_ = auVar91;
              local_740 = auVar174;
              if (auVar91._0_4_ < 0.0) {
                auVar174._0_4_ = sqrtf(auVar91._0_4_);
                auVar174._4_60_ = extraout_var;
                auVar91 = auVar174._0_16_;
              }
              else {
                auVar91 = vsqrtss_avx(auVar91,auVar91);
              }
              local_800._0_16_ = vdpps_avx(auVar94,auVar94,0x7f);
              fVar193 = local_800._0_4_;
              auVar204._4_12_ = ZEXT812(0) << 0x20;
              auVar204._0_4_ = fVar193;
              local_a40._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
              fVar195 = local_a40._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar95 = vxorps_avx512vl(local_800._0_16_,auVar30);
              auVar99 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar99._0_4_;
              local_9a0._0_4_ = auVar91._0_4_;
              if (fVar193 < auVar95._0_4_) {
                fVar163 = sqrtf(fVar193);
                auVar91 = ZEXT416((uint)local_9a0._0_4_);
              }
              else {
                auVar99 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar163 = auVar99._0_4_;
              }
              fVar197 = local_a40._0_4_;
              fVar193 = fVar195 * 1.5 + fVar193 * -0.5 * fVar197 * fVar197 * fVar197;
              auVar165._0_4_ = auVar94._0_4_ * fVar193;
              auVar165._4_4_ = auVar94._4_4_ * fVar193;
              auVar165._8_4_ = auVar94._8_4_ * fVar193;
              auVar165._12_4_ = auVar94._12_4_ * fVar193;
              local_a40._0_16_ = vdpps_avx(auVar5,auVar165,0x7f);
              auVar92 = vaddss_avx512f(auVar91,ZEXT416(0x3f800000));
              auVar166._0_4_ = local_a40._0_4_ * local_a40._0_4_;
              auVar166._4_4_ = local_a40._4_4_ * local_a40._4_4_;
              auVar166._8_4_ = local_a40._8_4_ * local_a40._8_4_;
              auVar166._12_4_ = local_a40._12_4_ * local_a40._12_4_;
              auVar99 = vsubps_avx(local_a80._0_16_,auVar166);
              fVar195 = auVar99._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar195;
              auVar95 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar96 = vmulss_avx512f(auVar95,ZEXT416(0x3fc00000));
              auVar97 = vmulss_avx512f(auVar99,ZEXT416(0xbf000000));
              uVar87 = fVar195 == 0.0;
              uVar86 = fVar195 < 0.0;
              if ((bool)uVar86) {
                local_920._0_4_ = fVar163;
                local_940._0_4_ = auVar96._0_4_;
                local_950._4_4_ = fVar193;
                local_950._0_4_ = fVar193;
                fStack_948 = fVar193;
                fStack_944 = fVar193;
                local_930 = auVar95;
                fVar195 = sqrtf(fVar195);
                auVar97 = ZEXT416(auVar97._0_4_);
                auVar96 = ZEXT416((uint)local_940._0_4_);
                auVar91 = ZEXT416((uint)local_9a0._0_4_);
                auVar92 = ZEXT416(auVar92._0_4_);
                auVar95 = local_930;
                fVar193 = (float)local_950._0_4_;
                fVar197 = (float)local_950._4_4_;
                fVar199 = fStack_948;
                fVar221 = fStack_944;
                fVar163 = (float)local_920._0_4_;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                fVar195 = auVar99._0_4_;
                fVar197 = fVar193;
                fVar199 = fVar193;
                fVar221 = fVar193;
              }
              auVar262 = ZEXT3264(local_aa0);
              auVar263 = ZEXT3264(local_ac0);
              auVar264 = ZEXT3264(local_ae0);
              auVar265 = ZEXT3264(local_b00);
              auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_)
              ;
              auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar175 = auVar99._0_4_ * 6.0;
              fVar192 = local_7e0._0_4_ * 6.0;
              auVar224._0_4_ = fVar192 * (float)local_8e0._0_4_;
              auVar224._4_4_ = fVar192 * (float)local_8e0._4_4_;
              auVar224._8_4_ = fVar192 * fStack_8d8;
              auVar224._12_4_ = fVar192 * fStack_8d4;
              auVar205._4_4_ = fVar175;
              auVar205._0_4_ = fVar175;
              auVar205._8_4_ = fVar175;
              auVar205._12_4_ = fVar175;
              auVar99 = vfmadd132ps_fma(auVar205,auVar224,local_8a0._0_16_);
              fVar175 = auVar100._0_4_ * 6.0;
              auVar178._4_4_ = fVar175;
              auVar178._0_4_ = fVar175;
              auVar178._8_4_ = fVar175;
              auVar178._12_4_ = fVar175;
              auVar99 = vfmadd132ps_fma(auVar178,auVar99,local_8c0._0_16_);
              fVar175 = local_7c0._0_4_ * 6.0;
              auVar206._4_4_ = fVar175;
              auVar206._0_4_ = fVar175;
              auVar206._8_4_ = fVar175;
              auVar206._12_4_ = fVar175;
              auVar99 = vfmadd132ps_fma(auVar206,auVar99,local_880._0_16_);
              auVar179._0_4_ = auVar99._0_4_ * (float)local_800._0_4_;
              auVar179._4_4_ = auVar99._4_4_ * (float)local_800._0_4_;
              auVar179._8_4_ = auVar99._8_4_ * (float)local_800._0_4_;
              auVar179._12_4_ = auVar99._12_4_ * (float)local_800._0_4_;
              auVar99 = vdpps_avx(auVar94,auVar99,0x7f);
              fVar175 = auVar99._0_4_;
              auVar207._0_4_ = auVar94._0_4_ * fVar175;
              auVar207._4_4_ = auVar94._4_4_ * fVar175;
              auVar207._8_4_ = auVar94._8_4_ * fVar175;
              auVar207._12_4_ = auVar94._12_4_ * fVar175;
              auVar99 = vsubps_avx(auVar179,auVar207);
              fVar175 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar100 = vmaxss_avx(ZEXT416((uint)fVar161),
                                    ZEXT416((uint)(local_740._0_4_ * fVar191 * 1.9073486e-06)));
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar98 = vxorps_avx512vl(auVar94,auVar31);
              auVar180._0_4_ = fVar193 * auVar99._0_4_ * fVar175;
              auVar180._4_4_ = fVar197 * auVar99._4_4_ * fVar175;
              auVar180._8_4_ = fVar199 * auVar99._8_4_ * fVar175;
              auVar180._12_4_ = fVar221 * auVar99._12_4_ * fVar175;
              auVar99 = vdpps_avx(auVar98,auVar165,0x7f);
              auVar101 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar161),auVar100);
              auVar91 = vdpps_avx(auVar5,auVar180,0x7f);
              vfmadd213ss_avx512f(auVar92,ZEXT416((uint)(fVar161 / fVar163)),auVar101);
              fVar193 = auVar99._0_4_ + auVar91._0_4_;
              auVar91 = vdpps_avx(local_a10,auVar165,0x7f);
              auVar99 = vdpps_avx(auVar5,auVar98,0x7f);
              auVar92 = vmulss_avx512f(auVar97,auVar95);
              auVar95 = vmulss_avx512f(auVar95,auVar95);
              auVar96 = vaddss_avx512f(auVar96,ZEXT416((uint)(auVar92._0_4_ * auVar95._0_4_)));
              auVar95 = vdpps_avx(auVar5,local_a10,0x7f);
              auVar97 = vfnmadd231ss_avx512f(auVar99,local_a40._0_16_,ZEXT416((uint)fVar193));
              auVar95 = vfnmadd231ss_avx512f(auVar95,local_a40._0_16_,auVar91);
              auVar99 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar195 = fVar195 - auVar99._0_4_;
              auVar92 = vshufps_avx(auVar94,auVar94,0xff);
              auVar99 = vfmsub213ss_fma(auVar97,auVar96,auVar92);
              auVar254._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
              auVar254._8_4_ = auVar99._8_4_ ^ 0x80000000;
              auVar254._12_4_ = auVar99._12_4_ ^ 0x80000000;
              auVar95 = ZEXT416((uint)(auVar95._0_4_ * auVar96._0_4_));
              auVar96 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar99._0_4_)),
                                        ZEXT416((uint)fVar193),auVar95);
              auVar99 = vinsertps_avx(auVar254,auVar95,0x1c);
              auVar244._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar244._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar244._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar95 = vinsertps_avx(ZEXT416((uint)fVar193),auVar244,0x10);
              auVar225._0_4_ = auVar96._0_4_;
              auVar225._4_4_ = auVar225._0_4_;
              auVar225._8_4_ = auVar225._0_4_;
              auVar225._12_4_ = auVar225._0_4_;
              auVar91 = vdivps_avx(auVar99,auVar225);
              auVar99 = vdivps_avx(auVar95,auVar225);
              auVar95 = vbroadcastss_avx512vl(local_a40._0_16_);
              auVar226._0_4_ = auVar95._0_4_ * auVar91._0_4_ + fVar195 * auVar99._0_4_;
              auVar226._4_4_ = auVar95._4_4_ * auVar91._4_4_ + fVar195 * auVar99._4_4_;
              auVar226._8_4_ = auVar95._8_4_ * auVar91._8_4_ + fVar195 * auVar99._8_4_;
              auVar226._12_4_ = auVar95._12_4_ * auVar91._12_4_ + fVar195 * auVar99._12_4_;
              auVar91 = vsubps_avx(local_740._0_16_,auVar226);
              auVar174 = ZEXT1664(auVar91);
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar99 = vandps_avx512vl(local_a40._0_16_,auVar32);
              auVar99 = vucomiss_avx512f(auVar99);
              if (!(bool)uVar86 && !(bool)uVar87) {
                auVar99 = vaddss_avx512f(auVar100,auVar99);
                auVar99 = vfmadd231ss_fma(auVar99,local_960,ZEXT416(0x36000000));
                auVar33._8_4_ = 0x7fffffff;
                auVar33._0_8_ = 0x7fffffff7fffffff;
                auVar33._12_4_ = 0x7fffffff;
                auVar95 = vandps_avx512vl(ZEXT416((uint)fVar195),auVar33);
                if (auVar95._0_4_ < auVar99._0_4_) {
                  fVar191 = auVar91._0_4_ + (float)local_970._0_4_;
                  if ((fVar191 < fVar222) ||
                     (fVar193 = *(float *)(ray + k * 4 + 0x200), fVar193 < fVar191)) break;
                  auVar91 = vmovshdup_avx(auVar91);
                  fVar195 = auVar91._0_4_;
                  if ((fVar195 < 0.0) || (1.0 < fVar195)) break;
                  auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a80._0_4_));
                  fVar163 = auVar91._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar83].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar163 = fVar163 * 1.5 +
                            (float)local_a80._0_4_ * -0.5 * fVar163 * fVar163 * fVar163;
                  auVar227._0_4_ = auVar5._0_4_ * fVar163;
                  auVar227._4_4_ = auVar5._4_4_ * fVar163;
                  auVar227._8_4_ = auVar5._8_4_ * fVar163;
                  auVar227._12_4_ = auVar5._12_4_ * fVar163;
                  auVar99 = vfmadd213ps_fma(auVar92,auVar227,auVar94);
                  auVar91 = vshufps_avx(auVar227,auVar227,0xc9);
                  auVar5 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar228._0_4_ = auVar227._0_4_ * auVar5._0_4_;
                  auVar228._4_4_ = auVar227._4_4_ * auVar5._4_4_;
                  auVar228._8_4_ = auVar227._8_4_ * auVar5._8_4_;
                  auVar228._12_4_ = auVar227._12_4_ * auVar5._12_4_;
                  auVar94 = vfmsub231ps_fma(auVar228,auVar94,auVar91);
                  auVar91 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar5 = vshufps_avx(auVar99,auVar99,0xc9);
                  auVar94 = vshufps_avx(auVar94,auVar94,0xd2);
                  auVar181._0_4_ = auVar99._0_4_ * auVar94._0_4_;
                  auVar181._4_4_ = auVar99._4_4_ * auVar94._4_4_;
                  auVar181._8_4_ = auVar99._8_4_ * auVar94._8_4_;
                  auVar181._12_4_ = auVar99._12_4_ * auVar94._12_4_;
                  auVar91 = vfmsub231ps_fma(auVar181,auVar91,auVar5);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar191;
                    uVar162 = vextractps_avx(auVar91,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar162;
                    uVar162 = vextractps_avx(auVar91,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar162;
                    *(int *)(ray + k * 4 + 0x380) = auVar91._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar195;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar83;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar9 = context->user;
                  auVar241 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar241,auVar174);
                  auVar174 = vpermps_avx512f(auVar241,ZEXT1664(auVar91));
                  auVar241 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar241,ZEXT1664(auVar91));
                  local_380 = vbroadcastss_avx512f(auVar91);
                  local_400[0] = (RTCHitN)auVar174[0];
                  local_400[1] = (RTCHitN)auVar174[1];
                  local_400[2] = (RTCHitN)auVar174[2];
                  local_400[3] = (RTCHitN)auVar174[3];
                  local_400[4] = (RTCHitN)auVar174[4];
                  local_400[5] = (RTCHitN)auVar174[5];
                  local_400[6] = (RTCHitN)auVar174[6];
                  local_400[7] = (RTCHitN)auVar174[7];
                  local_400[8] = (RTCHitN)auVar174[8];
                  local_400[9] = (RTCHitN)auVar174[9];
                  local_400[10] = (RTCHitN)auVar174[10];
                  local_400[0xb] = (RTCHitN)auVar174[0xb];
                  local_400[0xc] = (RTCHitN)auVar174[0xc];
                  local_400[0xd] = (RTCHitN)auVar174[0xd];
                  local_400[0xe] = (RTCHitN)auVar174[0xe];
                  local_400[0xf] = (RTCHitN)auVar174[0xf];
                  local_400[0x10] = (RTCHitN)auVar174[0x10];
                  local_400[0x11] = (RTCHitN)auVar174[0x11];
                  local_400[0x12] = (RTCHitN)auVar174[0x12];
                  local_400[0x13] = (RTCHitN)auVar174[0x13];
                  local_400[0x14] = (RTCHitN)auVar174[0x14];
                  local_400[0x15] = (RTCHitN)auVar174[0x15];
                  local_400[0x16] = (RTCHitN)auVar174[0x16];
                  local_400[0x17] = (RTCHitN)auVar174[0x17];
                  local_400[0x18] = (RTCHitN)auVar174[0x18];
                  local_400[0x19] = (RTCHitN)auVar174[0x19];
                  local_400[0x1a] = (RTCHitN)auVar174[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar174[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar174[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar174[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar174[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar174[0x1f];
                  local_400[0x20] = (RTCHitN)auVar174[0x20];
                  local_400[0x21] = (RTCHitN)auVar174[0x21];
                  local_400[0x22] = (RTCHitN)auVar174[0x22];
                  local_400[0x23] = (RTCHitN)auVar174[0x23];
                  local_400[0x24] = (RTCHitN)auVar174[0x24];
                  local_400[0x25] = (RTCHitN)auVar174[0x25];
                  local_400[0x26] = (RTCHitN)auVar174[0x26];
                  local_400[0x27] = (RTCHitN)auVar174[0x27];
                  local_400[0x28] = (RTCHitN)auVar174[0x28];
                  local_400[0x29] = (RTCHitN)auVar174[0x29];
                  local_400[0x2a] = (RTCHitN)auVar174[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar174[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar174[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar174[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar174[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar174[0x2f];
                  local_400[0x30] = (RTCHitN)auVar174[0x30];
                  local_400[0x31] = (RTCHitN)auVar174[0x31];
                  local_400[0x32] = (RTCHitN)auVar174[0x32];
                  local_400[0x33] = (RTCHitN)auVar174[0x33];
                  local_400[0x34] = (RTCHitN)auVar174[0x34];
                  local_400[0x35] = (RTCHitN)auVar174[0x35];
                  local_400[0x36] = (RTCHitN)auVar174[0x36];
                  local_400[0x37] = (RTCHitN)auVar174[0x37];
                  local_400[0x38] = (RTCHitN)auVar174[0x38];
                  local_400[0x39] = (RTCHitN)auVar174[0x39];
                  local_400[0x3a] = (RTCHitN)auVar174[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar174[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar174[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar174[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar174[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar174[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar174 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar174);
                  auVar116 = vpcmpeqd_avx2(auVar174._0_32_,auVar174._0_32_);
                  local_a48[3] = auVar116;
                  local_a48[2] = auVar116;
                  local_a48[1] = auVar116;
                  *local_a48 = auVar116;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar191;
                  auVar174 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar174);
                  local_b30.valid = (int *)local_700;
                  local_b30.geometryUserPtr = pGVar8->userPtr;
                  local_b30.context = context->user;
                  local_b30.hit = local_400;
                  local_b30.N = 0x10;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_b30);
                    auVar265 = ZEXT3264(local_b00);
                    auVar264 = ZEXT3264(local_ae0);
                    auVar263 = ZEXT3264(local_ac0);
                    auVar262 = ZEXT3264(local_aa0);
                    auVar174 = vmovdqa64_avx512f(local_700);
                  }
                  uVar26 = vptestmd_avx512f(auVar174,auVar174);
                  if ((short)uVar26 != 0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_b30);
                      auVar265 = ZEXT3264(local_b00);
                      auVar264 = ZEXT3264(local_ae0);
                      auVar263 = ZEXT3264(local_ac0);
                      auVar262 = ZEXT3264(local_aa0);
                      auVar174 = vmovdqa64_avx512f(local_700);
                    }
                    uVar88 = vptestmd_avx512f(auVar174,auVar174);
                    if ((short)uVar88 != 0) {
                      iVar3 = *(int *)(local_b30.hit + 4);
                      iVar4 = *(int *)(local_b30.hit + 8);
                      iVar1 = *(int *)(local_b30.hit + 0xc);
                      iVar58 = *(int *)(local_b30.hit + 0x10);
                      iVar59 = *(int *)(local_b30.hit + 0x14);
                      iVar60 = *(int *)(local_b30.hit + 0x18);
                      iVar61 = *(int *)(local_b30.hit + 0x1c);
                      iVar62 = *(int *)(local_b30.hit + 0x20);
                      iVar63 = *(int *)(local_b30.hit + 0x24);
                      iVar64 = *(int *)(local_b30.hit + 0x28);
                      iVar65 = *(int *)(local_b30.hit + 0x2c);
                      iVar66 = *(int *)(local_b30.hit + 0x30);
                      iVar67 = *(int *)(local_b30.hit + 0x34);
                      iVar68 = *(int *)(local_b30.hit + 0x38);
                      iVar69 = *(int *)(local_b30.hit + 0x3c);
                      bVar77 = (byte)uVar88;
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar76 = (byte)(uVar88 >> 8);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x300) =
                           (uint)(bVar77 & 1) * *(int *)local_b30.hit |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x300);
                      *(uint *)(local_b30.ray + 0x304) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x304);
                      *(uint *)(local_b30.ray + 0x308) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x308);
                      *(uint *)(local_b30.ray + 0x30c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x30c);
                      *(uint *)(local_b30.ray + 0x310) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x310);
                      *(uint *)(local_b30.ray + 0x314) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x314);
                      *(uint *)(local_b30.ray + 0x318) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x318);
                      *(uint *)(local_b30.ray + 0x31c) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x31c);
                      *(uint *)(local_b30.ray + 800) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b30.ray + 800);
                      *(uint *)(local_b30.ray + 0x324) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x324);
                      *(uint *)(local_b30.ray + 0x328) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x328);
                      *(uint *)(local_b30.ray + 0x32c) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x32c);
                      *(uint *)(local_b30.ray + 0x330) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x330);
                      *(uint *)(local_b30.ray + 0x334) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x334);
                      *(uint *)(local_b30.ray + 0x338) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x338);
                      *(uint *)(local_b30.ray + 0x33c) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x33c);
                      iVar3 = *(int *)(local_b30.hit + 0x44);
                      iVar4 = *(int *)(local_b30.hit + 0x48);
                      iVar1 = *(int *)(local_b30.hit + 0x4c);
                      iVar58 = *(int *)(local_b30.hit + 0x50);
                      iVar59 = *(int *)(local_b30.hit + 0x54);
                      iVar60 = *(int *)(local_b30.hit + 0x58);
                      iVar61 = *(int *)(local_b30.hit + 0x5c);
                      iVar62 = *(int *)(local_b30.hit + 0x60);
                      iVar63 = *(int *)(local_b30.hit + 100);
                      iVar64 = *(int *)(local_b30.hit + 0x68);
                      iVar65 = *(int *)(local_b30.hit + 0x6c);
                      iVar66 = *(int *)(local_b30.hit + 0x70);
                      iVar67 = *(int *)(local_b30.hit + 0x74);
                      iVar68 = *(int *)(local_b30.hit + 0x78);
                      iVar69 = *(int *)(local_b30.hit + 0x7c);
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x340) =
                           (uint)(bVar77 & 1) * *(int *)(local_b30.hit + 0x40) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x340);
                      *(uint *)(local_b30.ray + 0x344) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x344);
                      *(uint *)(local_b30.ray + 0x348) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x348);
                      *(uint *)(local_b30.ray + 0x34c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x34c);
                      *(uint *)(local_b30.ray + 0x350) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x350);
                      *(uint *)(local_b30.ray + 0x354) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x354);
                      *(uint *)(local_b30.ray + 0x358) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x358);
                      *(uint *)(local_b30.ray + 0x35c) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x35c);
                      *(uint *)(local_b30.ray + 0x360) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b30.ray + 0x360);
                      *(uint *)(local_b30.ray + 0x364) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x364);
                      *(uint *)(local_b30.ray + 0x368) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x368);
                      *(uint *)(local_b30.ray + 0x36c) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x36c);
                      *(uint *)(local_b30.ray + 0x370) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x370);
                      *(uint *)(local_b30.ray + 0x374) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x374);
                      *(uint *)(local_b30.ray + 0x378) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x378);
                      *(uint *)(local_b30.ray + 0x37c) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x37c);
                      iVar3 = *(int *)(local_b30.hit + 0x84);
                      iVar4 = *(int *)(local_b30.hit + 0x88);
                      iVar1 = *(int *)(local_b30.hit + 0x8c);
                      iVar58 = *(int *)(local_b30.hit + 0x90);
                      iVar59 = *(int *)(local_b30.hit + 0x94);
                      iVar60 = *(int *)(local_b30.hit + 0x98);
                      iVar61 = *(int *)(local_b30.hit + 0x9c);
                      iVar62 = *(int *)(local_b30.hit + 0xa0);
                      iVar63 = *(int *)(local_b30.hit + 0xa4);
                      iVar64 = *(int *)(local_b30.hit + 0xa8);
                      iVar65 = *(int *)(local_b30.hit + 0xac);
                      iVar66 = *(int *)(local_b30.hit + 0xb0);
                      iVar67 = *(int *)(local_b30.hit + 0xb4);
                      iVar68 = *(int *)(local_b30.hit + 0xb8);
                      iVar69 = *(int *)(local_b30.hit + 0xbc);
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x380) =
                           (uint)(bVar77 & 1) * *(int *)(local_b30.hit + 0x80) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x380);
                      *(uint *)(local_b30.ray + 900) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 900);
                      *(uint *)(local_b30.ray + 0x388) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x388);
                      *(uint *)(local_b30.ray + 0x38c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x38c);
                      *(uint *)(local_b30.ray + 0x390) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x390);
                      *(uint *)(local_b30.ray + 0x394) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x394);
                      *(uint *)(local_b30.ray + 0x398) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x398);
                      *(uint *)(local_b30.ray + 0x39c) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x39c);
                      *(uint *)(local_b30.ray + 0x3a0) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b30.ray + 0x3a0);
                      *(uint *)(local_b30.ray + 0x3a4) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3a4);
                      *(uint *)(local_b30.ray + 0x3a8) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3a8);
                      *(uint *)(local_b30.ray + 0x3ac) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3ac);
                      *(uint *)(local_b30.ray + 0x3b0) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3b0);
                      *(uint *)(local_b30.ray + 0x3b4) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3b4);
                      *(uint *)(local_b30.ray + 0x3b8) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3b8);
                      *(uint *)(local_b30.ray + 0x3bc) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3bc);
                      iVar3 = *(int *)(local_b30.hit + 0xc4);
                      iVar4 = *(int *)(local_b30.hit + 200);
                      iVar1 = *(int *)(local_b30.hit + 0xcc);
                      iVar58 = *(int *)(local_b30.hit + 0xd0);
                      iVar59 = *(int *)(local_b30.hit + 0xd4);
                      iVar60 = *(int *)(local_b30.hit + 0xd8);
                      iVar61 = *(int *)(local_b30.hit + 0xdc);
                      iVar62 = *(int *)(local_b30.hit + 0xe0);
                      iVar63 = *(int *)(local_b30.hit + 0xe4);
                      iVar64 = *(int *)(local_b30.hit + 0xe8);
                      iVar65 = *(int *)(local_b30.hit + 0xec);
                      iVar66 = *(int *)(local_b30.hit + 0xf0);
                      iVar67 = *(int *)(local_b30.hit + 0xf4);
                      iVar68 = *(int *)(local_b30.hit + 0xf8);
                      iVar69 = *(int *)(local_b30.hit + 0xfc);
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x3c0) =
                           (uint)(bVar77 & 1) * *(int *)(local_b30.hit + 0xc0) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x3c0);
                      *(uint *)(local_b30.ray + 0x3c4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x3c4);
                      *(uint *)(local_b30.ray + 0x3c8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x3c8);
                      *(uint *)(local_b30.ray + 0x3cc) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x3cc);
                      *(uint *)(local_b30.ray + 0x3d0) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x3d0);
                      *(uint *)(local_b30.ray + 0x3d4) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x3d4);
                      *(uint *)(local_b30.ray + 0x3d8) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3d8);
                      *(uint *)(local_b30.ray + 0x3dc) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3dc);
                      *(uint *)(local_b30.ray + 0x3e0) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b30.ray + 0x3e0);
                      *(uint *)(local_b30.ray + 0x3e4) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3e4);
                      *(uint *)(local_b30.ray + 1000) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 1000);
                      *(uint *)(local_b30.ray + 0x3ec) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3ec);
                      *(uint *)(local_b30.ray + 0x3f0) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3f0);
                      *(uint *)(local_b30.ray + 0x3f4) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3f4);
                      *(uint *)(local_b30.ray + 0x3f8) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3f8);
                      *(uint *)(local_b30.ray + 0x3fc) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3fc);
                      iVar3 = *(int *)(local_b30.hit + 0x104);
                      iVar4 = *(int *)(local_b30.hit + 0x108);
                      iVar1 = *(int *)(local_b30.hit + 0x10c);
                      iVar58 = *(int *)(local_b30.hit + 0x110);
                      iVar59 = *(int *)(local_b30.hit + 0x114);
                      iVar60 = *(int *)(local_b30.hit + 0x118);
                      iVar61 = *(int *)(local_b30.hit + 0x11c);
                      iVar62 = *(int *)(local_b30.hit + 0x120);
                      iVar63 = *(int *)(local_b30.hit + 0x124);
                      iVar64 = *(int *)(local_b30.hit + 0x128);
                      iVar65 = *(int *)(local_b30.hit + 300);
                      iVar66 = *(int *)(local_b30.hit + 0x130);
                      iVar67 = *(int *)(local_b30.hit + 0x134);
                      iVar68 = *(int *)(local_b30.hit + 0x138);
                      iVar69 = *(int *)(local_b30.hit + 0x13c);
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x400) =
                           (uint)(bVar77 & 1) * *(int *)(local_b30.hit + 0x100) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x400);
                      *(uint *)(local_b30.ray + 0x404) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x404);
                      *(uint *)(local_b30.ray + 0x408) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x408);
                      *(uint *)(local_b30.ray + 0x40c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x40c);
                      *(uint *)(local_b30.ray + 0x410) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x410);
                      *(uint *)(local_b30.ray + 0x414) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x414);
                      *(uint *)(local_b30.ray + 0x418) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x418);
                      *(uint *)(local_b30.ray + 0x41c) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x41c);
                      *(uint *)(local_b30.ray + 0x420) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b30.ray + 0x420);
                      *(uint *)(local_b30.ray + 0x424) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x424);
                      *(uint *)(local_b30.ray + 0x428) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x428);
                      *(uint *)(local_b30.ray + 0x42c) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x42c);
                      *(uint *)(local_b30.ray + 0x430) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x430);
                      *(uint *)(local_b30.ray + 0x434) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x434);
                      *(uint *)(local_b30.ray + 0x438) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x438);
                      *(uint *)(local_b30.ray + 0x43c) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x43c);
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140));
                      auVar174 = vmovdqu32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180));
                      auVar174 = vmovdqu32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0));
                      auVar174 = vmovdqa32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200));
                      auVar174 = vmovdqa32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar174;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar193;
                  break;
                }
              }
              lVar84 = lVar84 + -1;
            } while (lVar84 != 0);
            uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar172._4_4_ = uVar162;
            auVar172._0_4_ = uVar162;
            auVar172._8_4_ = uVar162;
            auVar172._12_4_ = uVar162;
            auVar172._16_4_ = uVar162;
            auVar172._20_4_ = uVar162;
            auVar172._24_4_ = uVar162;
            auVar172._28_4_ = uVar162;
            auVar70._4_4_ = fStack_69c;
            auVar70._0_4_ = local_6a0;
            auVar70._8_4_ = fStack_698;
            auVar70._12_4_ = fStack_694;
            auVar70._16_4_ = fStack_690;
            auVar70._20_4_ = fStack_68c;
            auVar70._24_4_ = fStack_688;
            auVar70._28_4_ = fStack_684;
            uVar26 = vcmpps_avx512vl(auVar172,auVar70,0xd);
            bVar85 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar85 & (byte)uVar26;
          } while (bVar85 != 0);
          auVar266 = ZEXT3264(local_a00);
          auVar106 = local_600;
        }
        bVar80 = local_6c0[0] | ~bVar80;
        auVar189._0_4_ = (float)local_9c0._0_4_ + auVar106._0_4_;
        auVar189._4_4_ = (float)local_9c0._4_4_ + auVar106._4_4_;
        auVar189._8_4_ = fStack_9b8 + auVar106._8_4_;
        auVar189._12_4_ = fStack_9b4 + auVar106._12_4_;
        auVar189._16_4_ = fStack_9b0 + auVar106._16_4_;
        auVar189._20_4_ = fStack_9ac + auVar106._20_4_;
        auVar189._24_4_ = fStack_9a8 + auVar106._24_4_;
        auVar189._28_4_ = fStack_9a4 + auVar106._28_4_;
        uVar26 = vcmpps_avx512vl(auVar189,auVar172,2);
        bVar75 = (byte)uVar27 & bVar75 & (byte)uVar26;
        auVar190._8_4_ = 2;
        auVar190._0_8_ = 0x200000002;
        auVar190._12_4_ = 2;
        auVar190._16_4_ = 2;
        auVar190._20_4_ = 2;
        auVar190._24_4_ = 2;
        auVar190._28_4_ = 2;
        auVar42._8_4_ = 3;
        auVar42._0_8_ = 0x300000003;
        auVar42._12_4_ = 3;
        auVar42._16_4_ = 3;
        auVar42._20_4_ = 3;
        auVar42._24_4_ = 3;
        auVar42._28_4_ = 3;
        auVar116 = vpblendmd_avx512vl(auVar190,auVar42);
        auVar151._0_4_ = (uint)(bVar80 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
        bVar11 = (bool)(bVar80 >> 1 & 1);
        auVar151._4_4_ = (uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 2 & 1);
        auVar151._8_4_ = (uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 3 & 1);
        auVar151._12_4_ = (uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 4 & 1);
        auVar151._16_4_ = (uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 5 & 1);
        auVar151._20_4_ = (uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 6 & 1);
        auVar151._24_4_ = (uint)bVar11 * auVar116._24_4_ | (uint)!bVar11 * 2;
        auVar151._28_4_ = (uint)(bVar80 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
        uVar26 = vpcmpd_avx512vl(local_660,auVar151,5);
        bVar80 = (byte)uVar26 & bVar75;
        fVar161 = (float)local_9c0._0_4_;
        fVar191 = (float)local_9c0._4_4_;
        fVar193 = fStack_9b8;
        fVar195 = fStack_9b4;
        fVar163 = fStack_9b0;
        fVar197 = fStack_9ac;
        fVar199 = fStack_9a8;
        fVar221 = fStack_9a4;
        if (bVar80 != 0) {
          auVar5 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar91 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar94 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar99 = vminps_avx(auVar5,auVar94);
          auVar5 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar94 = vmaxps_avx(auVar91,auVar5);
          auVar208._8_4_ = 0x7fffffff;
          auVar208._0_8_ = 0x7fffffff7fffffff;
          auVar208._12_4_ = 0x7fffffff;
          auVar91 = vandps_avx(auVar99,auVar208);
          auVar5 = vandps_avx(auVar94,auVar208);
          auVar91 = vmaxps_avx(auVar91,auVar5);
          auVar5 = vmovshdup_avx(auVar91);
          auVar5 = vmaxss_avx(auVar5,auVar91);
          auVar91 = vshufpd_avx(auVar91,auVar91,1);
          auVar91 = vmaxss_avx(auVar91,auVar5);
          fVar161 = auVar91._0_4_ * 1.9073486e-06;
          local_960 = vshufps_avx(auVar94,auVar94,0xff);
          local_6a0 = (float)local_9c0._0_4_ + local_640._0_4_;
          fStack_69c = (float)local_9c0._4_4_ + local_640._4_4_;
          fStack_698 = fStack_9b8 + local_640._8_4_;
          fStack_694 = fStack_9b4 + local_640._12_4_;
          fStack_690 = fStack_9b0 + local_640._16_4_;
          fStack_68c = fStack_9ac + local_640._20_4_;
          fStack_688 = fStack_9a8 + local_640._24_4_;
          fStack_684 = fStack_9a4 + local_640._28_4_;
          _local_900 = local_640;
          local_6c0 = auVar151;
          do {
            auVar173._8_4_ = 0x7f800000;
            auVar173._0_8_ = 0x7f8000007f800000;
            auVar173._12_4_ = 0x7f800000;
            auVar173._16_4_ = 0x7f800000;
            auVar173._20_4_ = 0x7f800000;
            auVar173._24_4_ = 0x7f800000;
            auVar173._28_4_ = 0x7f800000;
            auVar116 = vblendmps_avx512vl(auVar173,_local_900);
            auVar152._0_4_ =
                 (uint)(bVar80 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 1 & 1);
            auVar152._4_4_ = (uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 2 & 1);
            auVar152._8_4_ = (uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 3 & 1);
            auVar152._12_4_ = (uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 4 & 1);
            auVar152._16_4_ = (uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 5 & 1);
            auVar152._20_4_ = (uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * 0x7f800000;
            auVar152._24_4_ =
                 (uint)(bVar80 >> 6) * auVar116._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar116 = vshufps_avx(auVar152,auVar152,0xb1);
            auVar116 = vminps_avx(auVar152,auVar116);
            auVar106 = vshufpd_avx(auVar116,auVar116,5);
            auVar116 = vminps_avx(auVar116,auVar106);
            auVar106 = vpermpd_avx2(auVar116,0x4e);
            auVar116 = vminps_avx(auVar116,auVar106);
            uVar26 = vcmpps_avx512vl(auVar152,auVar116,0);
            bVar77 = (byte)uVar26 & bVar80;
            bVar85 = bVar80;
            if (bVar77 != 0) {
              bVar85 = bVar77;
            }
            iVar2 = 0;
            for (uVar90 = (uint)bVar85; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar90 = *(uint *)(local_500 + (uint)(iVar2 << 2));
            fVar191 = auVar93._0_4_;
            auVar91 = ZEXT416(*(uint *)(local_620 + (uint)(iVar2 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_620 + (uint)(iVar2 << 2)));
              fVar191 = sqrtf((float)local_a20._0_4_);
              auVar91 = local_a80._0_16_;
            }
            auVar91 = vinsertps_avx(auVar91,ZEXT416(uVar90),0x10);
            auVar174 = ZEXT1664(auVar91);
            lVar84 = 5;
            do {
              uVar162 = auVar174._0_4_;
              auVar167._4_4_ = uVar162;
              auVar167._0_4_ = uVar162;
              auVar167._8_4_ = uVar162;
              auVar167._12_4_ = uVar162;
              auVar5 = vfmadd132ps_fma(auVar167,ZEXT816(0) << 0x40,local_a10);
              auVar94 = auVar174._0_16_;
              auVar91 = vmovshdup_avx(auVar94);
              local_7e0._0_16_ = auVar91;
              fVar199 = 1.0 - auVar91._0_4_;
              auVar91 = vshufps_avx(auVar94,auVar94,0x55);
              fVar193 = auVar91._0_4_;
              auVar209._0_4_ = local_8c0._0_4_ * fVar193;
              fVar195 = auVar91._4_4_;
              auVar209._4_4_ = local_8c0._4_4_ * fVar195;
              fVar163 = auVar91._8_4_;
              auVar209._8_4_ = local_8c0._8_4_ * fVar163;
              fVar197 = auVar91._12_4_;
              auVar209._12_4_ = local_8c0._12_4_ * fVar197;
              _local_7c0 = ZEXT416((uint)fVar199);
              auVar229._4_4_ = fVar199;
              auVar229._0_4_ = fVar199;
              auVar229._8_4_ = fVar199;
              auVar229._12_4_ = fVar199;
              auVar91 = vfmadd231ps_fma(auVar209,auVar229,local_880._0_16_);
              auVar238._0_4_ = local_8a0._0_4_ * fVar193;
              auVar238._4_4_ = local_8a0._4_4_ * fVar195;
              auVar238._8_4_ = local_8a0._8_4_ * fVar163;
              auVar238._12_4_ = local_8a0._12_4_ * fVar197;
              auVar94 = vfmadd231ps_fma(auVar238,auVar229,local_8c0._0_16_);
              auVar245._0_4_ = fVar193 * (float)local_8e0._0_4_;
              auVar245._4_4_ = fVar195 * (float)local_8e0._4_4_;
              auVar245._8_4_ = fVar163 * fStack_8d8;
              auVar245._12_4_ = fVar197 * fStack_8d4;
              auVar99 = vfmadd231ps_fma(auVar245,auVar229,local_8a0._0_16_);
              auVar250._0_4_ = fVar193 * auVar94._0_4_;
              auVar250._4_4_ = fVar195 * auVar94._4_4_;
              auVar250._8_4_ = fVar163 * auVar94._8_4_;
              auVar250._12_4_ = fVar197 * auVar94._12_4_;
              auVar91 = vfmadd231ps_fma(auVar250,auVar229,auVar91);
              auVar210._0_4_ = fVar193 * auVar99._0_4_;
              auVar210._4_4_ = fVar195 * auVar99._4_4_;
              auVar210._8_4_ = fVar163 * auVar99._8_4_;
              auVar210._12_4_ = fVar197 * auVar99._12_4_;
              auVar94 = vfmadd231ps_fma(auVar210,auVar229,auVar94);
              auVar239._0_4_ = fVar193 * auVar94._0_4_;
              auVar239._4_4_ = fVar195 * auVar94._4_4_;
              auVar239._8_4_ = fVar163 * auVar94._8_4_;
              auVar239._12_4_ = fVar197 * auVar94._12_4_;
              auVar99 = vfmadd231ps_fma(auVar239,auVar91,auVar229);
              auVar91 = vsubps_avx(auVar94,auVar91);
              auVar34._8_4_ = 0x40400000;
              auVar34._0_8_ = 0x4040000040400000;
              auVar34._12_4_ = 0x40400000;
              auVar94 = vmulps_avx512vl(auVar91,auVar34);
              local_7a0._0_16_ = auVar99;
              auVar5 = vsubps_avx(auVar5,auVar99);
              auVar91 = vdpps_avx(auVar5,auVar5,0x7f);
              local_a80._0_16_ = auVar91;
              local_740 = auVar174;
              if (auVar91._0_4_ < 0.0) {
                auVar241._0_4_ = sqrtf(auVar91._0_4_);
                auVar241._4_60_ = extraout_var_00;
                auVar91 = auVar241._0_16_;
              }
              else {
                auVar91 = vsqrtss_avx(auVar91,auVar91);
              }
              local_800._0_16_ = vdpps_avx(auVar94,auVar94,0x7f);
              fVar193 = local_800._0_4_;
              auVar211._4_12_ = ZEXT812(0) << 0x20;
              auVar211._0_4_ = fVar193;
              local_a40._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar211);
              fVar195 = local_a40._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar211);
              auVar35._8_4_ = 0x80000000;
              auVar35._0_8_ = 0x8000000080000000;
              auVar35._12_4_ = 0x80000000;
              auVar95 = vxorps_avx512vl(local_800._0_16_,auVar35);
              auVar99 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar99._0_4_;
              local_9a0._0_4_ = auVar91._0_4_;
              if (fVar193 < auVar95._0_4_) {
                fVar163 = sqrtf(fVar193);
                auVar91 = ZEXT416((uint)local_9a0._0_4_);
              }
              else {
                auVar99 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar163 = auVar99._0_4_;
              }
              fVar197 = local_a40._0_4_;
              auVar92 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar195 * 1.5 +
                                                 fVar193 * -0.5 * fVar197 * fVar197 * fVar197)));
              auVar95 = vmulps_avx512vl(auVar94,auVar92);
              local_a40._0_16_ = vdpps_avx(auVar5,auVar95,0x7f);
              auVar97 = vaddss_avx512f(auVar91,ZEXT416(0x3f800000));
              auVar168._0_4_ = local_a40._0_4_ * local_a40._0_4_;
              auVar168._4_4_ = local_a40._4_4_ * local_a40._4_4_;
              auVar168._8_4_ = local_a40._8_4_ * local_a40._8_4_;
              auVar168._12_4_ = local_a40._12_4_ * local_a40._12_4_;
              auVar99 = vsubps_avx(local_a80._0_16_,auVar168);
              fVar193 = auVar99._0_4_;
              auVar182._4_12_ = ZEXT812(0) << 0x20;
              auVar182._0_4_ = fVar193;
              auVar96 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
              auVar100 = vmulss_avx512f(auVar96,ZEXT416(0x3fc00000));
              auVar101 = vmulss_avx512f(auVar99,ZEXT416(0xbf000000));
              uVar87 = fVar193 == 0.0;
              uVar86 = fVar193 < 0.0;
              if ((bool)uVar86) {
                local_930._0_4_ = auVar100._0_4_;
                _local_950 = auVar92;
                local_940 = auVar95;
                local_920 = auVar96;
                fVar193 = sqrtf(fVar193);
                auVar101 = ZEXT416(auVar101._0_4_);
                auVar100 = ZEXT416((uint)local_930._0_4_);
                auVar91 = ZEXT416((uint)local_9a0._0_4_);
                auVar97 = ZEXT416(auVar97._0_4_);
                auVar95 = local_940;
                auVar96 = local_920;
                auVar92 = _local_950;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                fVar193 = auVar99._0_4_;
              }
              auVar262 = ZEXT3264(local_aa0);
              auVar263 = ZEXT3264(local_ac0);
              auVar264 = ZEXT3264(local_ae0);
              auVar265 = ZEXT3264(local_b00);
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar195 = auVar99._0_4_ * 6.0;
              fVar197 = local_7e0._0_4_ * 6.0;
              auVar230._0_4_ = fVar197 * (float)local_8e0._0_4_;
              auVar230._4_4_ = fVar197 * (float)local_8e0._4_4_;
              auVar230._8_4_ = fVar197 * fStack_8d8;
              auVar230._12_4_ = fVar197 * fStack_8d4;
              auVar212._4_4_ = fVar195;
              auVar212._0_4_ = fVar195;
              auVar212._8_4_ = fVar195;
              auVar212._12_4_ = fVar195;
              auVar99 = vfmadd132ps_fma(auVar212,auVar230,local_8a0._0_16_);
              fVar195 = auVar98._0_4_ * 6.0;
              auVar183._4_4_ = fVar195;
              auVar183._0_4_ = fVar195;
              auVar183._8_4_ = fVar195;
              auVar183._12_4_ = fVar195;
              auVar99 = vfmadd132ps_fma(auVar183,auVar99,local_8c0._0_16_);
              fVar195 = local_7c0._0_4_ * 6.0;
              auVar213._4_4_ = fVar195;
              auVar213._0_4_ = fVar195;
              auVar213._8_4_ = fVar195;
              auVar213._12_4_ = fVar195;
              auVar99 = vfmadd132ps_fma(auVar213,auVar99,local_880._0_16_);
              auVar184._0_4_ = auVar99._0_4_ * (float)local_800._0_4_;
              auVar184._4_4_ = auVar99._4_4_ * (float)local_800._0_4_;
              auVar184._8_4_ = auVar99._8_4_ * (float)local_800._0_4_;
              auVar184._12_4_ = auVar99._12_4_ * (float)local_800._0_4_;
              auVar99 = vdpps_avx(auVar94,auVar99,0x7f);
              fVar195 = auVar99._0_4_;
              auVar214._0_4_ = auVar94._0_4_ * fVar195;
              auVar214._4_4_ = auVar94._4_4_ * fVar195;
              auVar214._8_4_ = auVar94._8_4_ * fVar195;
              auVar214._12_4_ = auVar94._12_4_ * fVar195;
              auVar99 = vsubps_avx(auVar184,auVar214);
              fVar195 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar98 = vmaxss_avx(ZEXT416((uint)fVar161),
                                   ZEXT416((uint)(local_740._0_4_ * fVar191 * 1.9073486e-06)));
              auVar185._0_4_ = auVar99._0_4_ * fVar195;
              auVar185._4_4_ = auVar99._4_4_ * fVar195;
              auVar185._8_4_ = auVar99._8_4_ * fVar195;
              auVar185._12_4_ = auVar99._12_4_ * fVar195;
              auVar36._8_4_ = 0x80000000;
              auVar36._0_8_ = 0x8000000080000000;
              auVar36._12_4_ = 0x80000000;
              auVar102 = vxorps_avx512vl(auVar94,auVar36);
              auVar103 = vmulps_avx512vl(auVar92,auVar185);
              auVar99 = vdpps_avx(auVar102,auVar95,0x7f);
              auVar92 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar161),auVar98);
              auVar91 = vdpps_avx(auVar5,auVar103,0x7f);
              vfmadd213ss_avx512f(auVar97,ZEXT416((uint)(fVar161 / fVar163)),auVar92);
              fVar195 = auVar99._0_4_ + auVar91._0_4_;
              auVar91 = vdpps_avx(local_a10,auVar95,0x7f);
              auVar99 = vdpps_avx(auVar5,auVar102,0x7f);
              auVar95 = vmulss_avx512f(auVar101,auVar96);
              auVar92 = vmulss_avx512f(auVar96,auVar96);
              auVar96 = vaddss_avx512f(auVar100,ZEXT416((uint)(auVar95._0_4_ * auVar92._0_4_)));
              auVar95 = vdpps_avx(auVar5,local_a10,0x7f);
              auVar97 = vfnmadd231ss_avx512f(auVar99,local_a40._0_16_,ZEXT416((uint)fVar195));
              auVar95 = vfnmadd231ss_avx512f(auVar95,local_a40._0_16_,auVar91);
              auVar99 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar193 = fVar193 - auVar99._0_4_;
              auVar92 = vshufps_avx(auVar94,auVar94,0xff);
              auVar99 = vfmsub213ss_fma(auVar97,auVar96,auVar92);
              auVar255._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
              auVar255._8_4_ = auVar99._8_4_ ^ 0x80000000;
              auVar255._12_4_ = auVar99._12_4_ ^ 0x80000000;
              auVar95 = ZEXT416((uint)(auVar95._0_4_ * auVar96._0_4_));
              auVar96 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar99._0_4_)),
                                        ZEXT416((uint)fVar195),auVar95);
              auVar99 = vinsertps_avx(auVar255,auVar95,0x1c);
              auVar246._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar246._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar246._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar95 = vinsertps_avx(ZEXT416((uint)fVar195),auVar246,0x10);
              auVar231._0_4_ = auVar96._0_4_;
              auVar231._4_4_ = auVar231._0_4_;
              auVar231._8_4_ = auVar231._0_4_;
              auVar231._12_4_ = auVar231._0_4_;
              auVar91 = vdivps_avx(auVar99,auVar231);
              auVar99 = vdivps_avx(auVar95,auVar231);
              auVar95 = vbroadcastss_avx512vl(local_a40._0_16_);
              auVar232._0_4_ = auVar95._0_4_ * auVar91._0_4_ + fVar193 * auVar99._0_4_;
              auVar232._4_4_ = auVar95._4_4_ * auVar91._4_4_ + fVar193 * auVar99._4_4_;
              auVar232._8_4_ = auVar95._8_4_ * auVar91._8_4_ + fVar193 * auVar99._8_4_;
              auVar232._12_4_ = auVar95._12_4_ * auVar91._12_4_ + fVar193 * auVar99._12_4_;
              auVar91 = vsubps_avx(local_740._0_16_,auVar232);
              auVar174 = ZEXT1664(auVar91);
              auVar37._8_4_ = 0x7fffffff;
              auVar37._0_8_ = 0x7fffffff7fffffff;
              auVar37._12_4_ = 0x7fffffff;
              auVar99 = vandps_avx512vl(local_a40._0_16_,auVar37);
              auVar99 = vucomiss_avx512f(auVar99);
              if (!(bool)uVar86 && !(bool)uVar87) {
                auVar99 = vaddss_avx512f(auVar98,auVar99);
                auVar99 = vfmadd231ss_fma(auVar99,local_960,ZEXT416(0x36000000));
                auVar38._8_4_ = 0x7fffffff;
                auVar38._0_8_ = 0x7fffffff7fffffff;
                auVar38._12_4_ = 0x7fffffff;
                auVar95 = vandps_avx512vl(ZEXT416((uint)fVar193),auVar38);
                if (auVar95._0_4_ < auVar99._0_4_) {
                  fVar191 = auVar91._0_4_ + (float)local_970._0_4_;
                  if ((fVar191 < fVar222) ||
                     (fVar193 = *(float *)(ray + k * 4 + 0x200), fVar193 < fVar191)) break;
                  auVar91 = vmovshdup_avx(auVar91);
                  fVar195 = auVar91._0_4_;
                  if ((fVar195 < 0.0) || (1.0 < fVar195)) break;
                  auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a80._0_4_));
                  fVar163 = auVar91._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar83].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar163 = fVar163 * 1.5 +
                            (float)local_a80._0_4_ * -0.5 * fVar163 * fVar163 * fVar163;
                  auVar233._0_4_ = auVar5._0_4_ * fVar163;
                  auVar233._4_4_ = auVar5._4_4_ * fVar163;
                  auVar233._8_4_ = auVar5._8_4_ * fVar163;
                  auVar233._12_4_ = auVar5._12_4_ * fVar163;
                  auVar99 = vfmadd213ps_fma(auVar92,auVar233,auVar94);
                  auVar91 = vshufps_avx(auVar233,auVar233,0xc9);
                  auVar5 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar234._0_4_ = auVar233._0_4_ * auVar5._0_4_;
                  auVar234._4_4_ = auVar233._4_4_ * auVar5._4_4_;
                  auVar234._8_4_ = auVar233._8_4_ * auVar5._8_4_;
                  auVar234._12_4_ = auVar233._12_4_ * auVar5._12_4_;
                  auVar94 = vfmsub231ps_fma(auVar234,auVar94,auVar91);
                  auVar91 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar5 = vshufps_avx(auVar99,auVar99,0xc9);
                  auVar94 = vshufps_avx(auVar94,auVar94,0xd2);
                  auVar186._0_4_ = auVar99._0_4_ * auVar94._0_4_;
                  auVar186._4_4_ = auVar99._4_4_ * auVar94._4_4_;
                  auVar186._8_4_ = auVar99._8_4_ * auVar94._8_4_;
                  auVar186._12_4_ = auVar99._12_4_ * auVar94._12_4_;
                  auVar91 = vfmsub231ps_fma(auVar186,auVar91,auVar5);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar191;
                    uVar162 = vextractps_avx(auVar91,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar162;
                    uVar162 = vextractps_avx(auVar91,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar162;
                    *(int *)(ray + k * 4 + 0x380) = auVar91._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar195;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar83;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar9 = context->user;
                  auVar241 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar241,auVar174);
                  auVar174 = vpermps_avx512f(auVar241,ZEXT1664(auVar91));
                  auVar241 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar241,ZEXT1664(auVar91));
                  local_380 = vbroadcastss_avx512f(auVar91);
                  local_400[0] = (RTCHitN)auVar174[0];
                  local_400[1] = (RTCHitN)auVar174[1];
                  local_400[2] = (RTCHitN)auVar174[2];
                  local_400[3] = (RTCHitN)auVar174[3];
                  local_400[4] = (RTCHitN)auVar174[4];
                  local_400[5] = (RTCHitN)auVar174[5];
                  local_400[6] = (RTCHitN)auVar174[6];
                  local_400[7] = (RTCHitN)auVar174[7];
                  local_400[8] = (RTCHitN)auVar174[8];
                  local_400[9] = (RTCHitN)auVar174[9];
                  local_400[10] = (RTCHitN)auVar174[10];
                  local_400[0xb] = (RTCHitN)auVar174[0xb];
                  local_400[0xc] = (RTCHitN)auVar174[0xc];
                  local_400[0xd] = (RTCHitN)auVar174[0xd];
                  local_400[0xe] = (RTCHitN)auVar174[0xe];
                  local_400[0xf] = (RTCHitN)auVar174[0xf];
                  local_400[0x10] = (RTCHitN)auVar174[0x10];
                  local_400[0x11] = (RTCHitN)auVar174[0x11];
                  local_400[0x12] = (RTCHitN)auVar174[0x12];
                  local_400[0x13] = (RTCHitN)auVar174[0x13];
                  local_400[0x14] = (RTCHitN)auVar174[0x14];
                  local_400[0x15] = (RTCHitN)auVar174[0x15];
                  local_400[0x16] = (RTCHitN)auVar174[0x16];
                  local_400[0x17] = (RTCHitN)auVar174[0x17];
                  local_400[0x18] = (RTCHitN)auVar174[0x18];
                  local_400[0x19] = (RTCHitN)auVar174[0x19];
                  local_400[0x1a] = (RTCHitN)auVar174[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar174[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar174[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar174[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar174[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar174[0x1f];
                  local_400[0x20] = (RTCHitN)auVar174[0x20];
                  local_400[0x21] = (RTCHitN)auVar174[0x21];
                  local_400[0x22] = (RTCHitN)auVar174[0x22];
                  local_400[0x23] = (RTCHitN)auVar174[0x23];
                  local_400[0x24] = (RTCHitN)auVar174[0x24];
                  local_400[0x25] = (RTCHitN)auVar174[0x25];
                  local_400[0x26] = (RTCHitN)auVar174[0x26];
                  local_400[0x27] = (RTCHitN)auVar174[0x27];
                  local_400[0x28] = (RTCHitN)auVar174[0x28];
                  local_400[0x29] = (RTCHitN)auVar174[0x29];
                  local_400[0x2a] = (RTCHitN)auVar174[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar174[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar174[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar174[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar174[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar174[0x2f];
                  local_400[0x30] = (RTCHitN)auVar174[0x30];
                  local_400[0x31] = (RTCHitN)auVar174[0x31];
                  local_400[0x32] = (RTCHitN)auVar174[0x32];
                  local_400[0x33] = (RTCHitN)auVar174[0x33];
                  local_400[0x34] = (RTCHitN)auVar174[0x34];
                  local_400[0x35] = (RTCHitN)auVar174[0x35];
                  local_400[0x36] = (RTCHitN)auVar174[0x36];
                  local_400[0x37] = (RTCHitN)auVar174[0x37];
                  local_400[0x38] = (RTCHitN)auVar174[0x38];
                  local_400[0x39] = (RTCHitN)auVar174[0x39];
                  local_400[0x3a] = (RTCHitN)auVar174[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar174[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar174[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar174[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar174[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar174[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar174 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar174);
                  auVar116 = vpcmpeqd_avx2(auVar174._0_32_,auVar174._0_32_);
                  local_a48[3] = auVar116;
                  local_a48[2] = auVar116;
                  local_a48[1] = auVar116;
                  *local_a48 = auVar116;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar191;
                  auVar174 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar174);
                  local_b30.valid = (int *)local_700;
                  local_b30.geometryUserPtr = pGVar8->userPtr;
                  local_b30.context = context->user;
                  local_b30.hit = local_400;
                  local_b30.N = 0x10;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_b30);
                    auVar265 = ZEXT3264(local_b00);
                    auVar264 = ZEXT3264(local_ae0);
                    auVar263 = ZEXT3264(local_ac0);
                    auVar262 = ZEXT3264(local_aa0);
                    auVar174 = vmovdqa64_avx512f(local_700);
                  }
                  uVar26 = vptestmd_avx512f(auVar174,auVar174);
                  if ((short)uVar26 != 0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_b30);
                      auVar265 = ZEXT3264(local_b00);
                      auVar264 = ZEXT3264(local_ae0);
                      auVar263 = ZEXT3264(local_ac0);
                      auVar262 = ZEXT3264(local_aa0);
                      auVar174 = vmovdqa64_avx512f(local_700);
                    }
                    uVar88 = vptestmd_avx512f(auVar174,auVar174);
                    if ((short)uVar88 != 0) {
                      iVar3 = *(int *)(local_b30.hit + 4);
                      iVar4 = *(int *)(local_b30.hit + 8);
                      iVar1 = *(int *)(local_b30.hit + 0xc);
                      iVar58 = *(int *)(local_b30.hit + 0x10);
                      iVar59 = *(int *)(local_b30.hit + 0x14);
                      iVar60 = *(int *)(local_b30.hit + 0x18);
                      iVar61 = *(int *)(local_b30.hit + 0x1c);
                      iVar62 = *(int *)(local_b30.hit + 0x20);
                      iVar63 = *(int *)(local_b30.hit + 0x24);
                      iVar64 = *(int *)(local_b30.hit + 0x28);
                      iVar65 = *(int *)(local_b30.hit + 0x2c);
                      iVar66 = *(int *)(local_b30.hit + 0x30);
                      iVar67 = *(int *)(local_b30.hit + 0x34);
                      iVar68 = *(int *)(local_b30.hit + 0x38);
                      iVar69 = *(int *)(local_b30.hit + 0x3c);
                      bVar85 = (byte)uVar88;
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar77 = (byte)(uVar88 >> 8);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x300) =
                           (uint)(bVar85 & 1) * *(int *)local_b30.hit |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_b30.ray + 0x300);
                      *(uint *)(local_b30.ray + 0x304) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x304);
                      *(uint *)(local_b30.ray + 0x308) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x308);
                      *(uint *)(local_b30.ray + 0x30c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x30c);
                      *(uint *)(local_b30.ray + 0x310) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x310);
                      *(uint *)(local_b30.ray + 0x314) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x314);
                      *(uint *)(local_b30.ray + 0x318) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x318);
                      *(uint *)(local_b30.ray + 0x31c) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x31c);
                      *(uint *)(local_b30.ray + 800) =
                           (uint)(bVar77 & 1) * iVar62 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 800);
                      *(uint *)(local_b30.ray + 0x324) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x324);
                      *(uint *)(local_b30.ray + 0x328) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x328);
                      *(uint *)(local_b30.ray + 0x32c) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x32c);
                      *(uint *)(local_b30.ray + 0x330) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x330);
                      *(uint *)(local_b30.ray + 0x334) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x334);
                      *(uint *)(local_b30.ray + 0x338) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x338);
                      *(uint *)(local_b30.ray + 0x33c) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x33c);
                      iVar3 = *(int *)(local_b30.hit + 0x44);
                      iVar4 = *(int *)(local_b30.hit + 0x48);
                      iVar1 = *(int *)(local_b30.hit + 0x4c);
                      iVar58 = *(int *)(local_b30.hit + 0x50);
                      iVar59 = *(int *)(local_b30.hit + 0x54);
                      iVar60 = *(int *)(local_b30.hit + 0x58);
                      iVar61 = *(int *)(local_b30.hit + 0x5c);
                      iVar62 = *(int *)(local_b30.hit + 0x60);
                      iVar63 = *(int *)(local_b30.hit + 100);
                      iVar64 = *(int *)(local_b30.hit + 0x68);
                      iVar65 = *(int *)(local_b30.hit + 0x6c);
                      iVar66 = *(int *)(local_b30.hit + 0x70);
                      iVar67 = *(int *)(local_b30.hit + 0x74);
                      iVar68 = *(int *)(local_b30.hit + 0x78);
                      iVar69 = *(int *)(local_b30.hit + 0x7c);
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x340) =
                           (uint)(bVar85 & 1) * *(int *)(local_b30.hit + 0x40) |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_b30.ray + 0x340);
                      *(uint *)(local_b30.ray + 0x344) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x344);
                      *(uint *)(local_b30.ray + 0x348) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x348);
                      *(uint *)(local_b30.ray + 0x34c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x34c);
                      *(uint *)(local_b30.ray + 0x350) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x350);
                      *(uint *)(local_b30.ray + 0x354) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x354);
                      *(uint *)(local_b30.ray + 0x358) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x358);
                      *(uint *)(local_b30.ray + 0x35c) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x35c);
                      *(uint *)(local_b30.ray + 0x360) =
                           (uint)(bVar77 & 1) * iVar62 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x360);
                      *(uint *)(local_b30.ray + 0x364) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x364);
                      *(uint *)(local_b30.ray + 0x368) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x368);
                      *(uint *)(local_b30.ray + 0x36c) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x36c);
                      *(uint *)(local_b30.ray + 0x370) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x370);
                      *(uint *)(local_b30.ray + 0x374) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x374);
                      *(uint *)(local_b30.ray + 0x378) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x378);
                      *(uint *)(local_b30.ray + 0x37c) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x37c);
                      iVar3 = *(int *)(local_b30.hit + 0x84);
                      iVar4 = *(int *)(local_b30.hit + 0x88);
                      iVar1 = *(int *)(local_b30.hit + 0x8c);
                      iVar58 = *(int *)(local_b30.hit + 0x90);
                      iVar59 = *(int *)(local_b30.hit + 0x94);
                      iVar60 = *(int *)(local_b30.hit + 0x98);
                      iVar61 = *(int *)(local_b30.hit + 0x9c);
                      iVar62 = *(int *)(local_b30.hit + 0xa0);
                      iVar63 = *(int *)(local_b30.hit + 0xa4);
                      iVar64 = *(int *)(local_b30.hit + 0xa8);
                      iVar65 = *(int *)(local_b30.hit + 0xac);
                      iVar66 = *(int *)(local_b30.hit + 0xb0);
                      iVar67 = *(int *)(local_b30.hit + 0xb4);
                      iVar68 = *(int *)(local_b30.hit + 0xb8);
                      iVar69 = *(int *)(local_b30.hit + 0xbc);
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x380) =
                           (uint)(bVar85 & 1) * *(int *)(local_b30.hit + 0x80) |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_b30.ray + 0x380);
                      *(uint *)(local_b30.ray + 900) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 900);
                      *(uint *)(local_b30.ray + 0x388) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x388);
                      *(uint *)(local_b30.ray + 0x38c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x38c);
                      *(uint *)(local_b30.ray + 0x390) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x390);
                      *(uint *)(local_b30.ray + 0x394) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x394);
                      *(uint *)(local_b30.ray + 0x398) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x398);
                      *(uint *)(local_b30.ray + 0x39c) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x39c);
                      *(uint *)(local_b30.ray + 0x3a0) =
                           (uint)(bVar77 & 1) * iVar62 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x3a0);
                      *(uint *)(local_b30.ray + 0x3a4) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3a4);
                      *(uint *)(local_b30.ray + 0x3a8) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3a8);
                      *(uint *)(local_b30.ray + 0x3ac) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3ac);
                      *(uint *)(local_b30.ray + 0x3b0) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3b0);
                      *(uint *)(local_b30.ray + 0x3b4) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3b4);
                      *(uint *)(local_b30.ray + 0x3b8) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3b8);
                      *(uint *)(local_b30.ray + 0x3bc) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3bc);
                      iVar3 = *(int *)(local_b30.hit + 0xc4);
                      iVar4 = *(int *)(local_b30.hit + 200);
                      iVar1 = *(int *)(local_b30.hit + 0xcc);
                      iVar58 = *(int *)(local_b30.hit + 0xd0);
                      iVar59 = *(int *)(local_b30.hit + 0xd4);
                      iVar60 = *(int *)(local_b30.hit + 0xd8);
                      iVar61 = *(int *)(local_b30.hit + 0xdc);
                      iVar62 = *(int *)(local_b30.hit + 0xe0);
                      iVar63 = *(int *)(local_b30.hit + 0xe4);
                      iVar64 = *(int *)(local_b30.hit + 0xe8);
                      iVar65 = *(int *)(local_b30.hit + 0xec);
                      iVar66 = *(int *)(local_b30.hit + 0xf0);
                      iVar67 = *(int *)(local_b30.hit + 0xf4);
                      iVar68 = *(int *)(local_b30.hit + 0xf8);
                      iVar69 = *(int *)(local_b30.hit + 0xfc);
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x3c0) =
                           (uint)(bVar85 & 1) * *(int *)(local_b30.hit + 0xc0) |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_b30.ray + 0x3c0);
                      *(uint *)(local_b30.ray + 0x3c4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x3c4);
                      *(uint *)(local_b30.ray + 0x3c8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x3c8);
                      *(uint *)(local_b30.ray + 0x3cc) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x3cc);
                      *(uint *)(local_b30.ray + 0x3d0) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x3d0);
                      *(uint *)(local_b30.ray + 0x3d4) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x3d4);
                      *(uint *)(local_b30.ray + 0x3d8) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3d8);
                      *(uint *)(local_b30.ray + 0x3dc) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3dc);
                      *(uint *)(local_b30.ray + 0x3e0) =
                           (uint)(bVar77 & 1) * iVar62 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x3e0);
                      *(uint *)(local_b30.ray + 0x3e4) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3e4);
                      *(uint *)(local_b30.ray + 1000) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 1000);
                      *(uint *)(local_b30.ray + 0x3ec) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3ec);
                      *(uint *)(local_b30.ray + 0x3f0) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3f0);
                      *(uint *)(local_b30.ray + 0x3f4) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3f4);
                      *(uint *)(local_b30.ray + 0x3f8) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3f8);
                      *(uint *)(local_b30.ray + 0x3fc) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3fc);
                      iVar3 = *(int *)(local_b30.hit + 0x104);
                      iVar4 = *(int *)(local_b30.hit + 0x108);
                      iVar1 = *(int *)(local_b30.hit + 0x10c);
                      iVar58 = *(int *)(local_b30.hit + 0x110);
                      iVar59 = *(int *)(local_b30.hit + 0x114);
                      iVar60 = *(int *)(local_b30.hit + 0x118);
                      iVar61 = *(int *)(local_b30.hit + 0x11c);
                      iVar62 = *(int *)(local_b30.hit + 0x120);
                      iVar63 = *(int *)(local_b30.hit + 0x124);
                      iVar64 = *(int *)(local_b30.hit + 0x128);
                      iVar65 = *(int *)(local_b30.hit + 300);
                      iVar66 = *(int *)(local_b30.hit + 0x130);
                      iVar67 = *(int *)(local_b30.hit + 0x134);
                      iVar68 = *(int *)(local_b30.hit + 0x138);
                      iVar69 = *(int *)(local_b30.hit + 0x13c);
                      bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar88 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar88 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar88 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar88 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar88 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar88 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar88 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar88 >> 0xe) & 1);
                      bVar24 = SUB81(uVar88 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x400) =
                           (uint)(bVar85 & 1) * *(int *)(local_b30.hit + 0x100) |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_b30.ray + 0x400);
                      *(uint *)(local_b30.ray + 0x404) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x404);
                      *(uint *)(local_b30.ray + 0x408) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x408);
                      *(uint *)(local_b30.ray + 0x40c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x40c);
                      *(uint *)(local_b30.ray + 0x410) =
                           (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x410);
                      *(uint *)(local_b30.ray + 0x414) =
                           (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x414);
                      *(uint *)(local_b30.ray + 0x418) =
                           (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x418);
                      *(uint *)(local_b30.ray + 0x41c) =
                           (uint)bVar17 * iVar61 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x41c);
                      *(uint *)(local_b30.ray + 0x420) =
                           (uint)(bVar77 & 1) * iVar62 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x420);
                      *(uint *)(local_b30.ray + 0x424) =
                           (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x424);
                      *(uint *)(local_b30.ray + 0x428) =
                           (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x428);
                      *(uint *)(local_b30.ray + 0x42c) =
                           (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x42c);
                      *(uint *)(local_b30.ray + 0x430) =
                           (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x430);
                      *(uint *)(local_b30.ray + 0x434) =
                           (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x434);
                      *(uint *)(local_b30.ray + 0x438) =
                           (uint)bVar23 * iVar68 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x438);
                      *(uint *)(local_b30.ray + 0x43c) =
                           (uint)bVar24 * iVar69 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x43c);
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140));
                      auVar174 = vmovdqu32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180));
                      auVar174 = vmovdqu32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0));
                      auVar174 = vmovdqa32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200));
                      auVar174 = vmovdqa32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar174;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar193;
                  break;
                }
              }
              lVar84 = lVar84 + -1;
            } while (lVar84 != 0);
            uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar172._4_4_ = uVar162;
            auVar172._0_4_ = uVar162;
            auVar172._8_4_ = uVar162;
            auVar172._12_4_ = uVar162;
            auVar172._16_4_ = uVar162;
            auVar172._20_4_ = uVar162;
            auVar172._24_4_ = uVar162;
            auVar172._28_4_ = uVar162;
            auVar71._4_4_ = fStack_69c;
            auVar71._0_4_ = local_6a0;
            auVar71._8_4_ = fStack_698;
            auVar71._12_4_ = fStack_694;
            auVar71._16_4_ = fStack_690;
            auVar71._20_4_ = fStack_68c;
            auVar71._24_4_ = fStack_688;
            auVar71._28_4_ = fStack_684;
            uVar26 = vcmpps_avx512vl(auVar172,auVar71,0xd);
            bVar80 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar80 & (byte)uVar26;
          } while (bVar80 != 0);
          auVar266 = ZEXT3264(local_a00);
          auVar151 = local_6c0;
          fVar161 = (float)local_9c0._0_4_;
          fVar191 = (float)local_9c0._4_4_;
          fVar193 = fStack_9b8;
          fVar195 = fStack_9b4;
          fVar163 = fStack_9b0;
          fVar197 = fStack_9ac;
          fVar199 = fStack_9a8;
          fVar221 = fStack_9a4;
        }
        auVar241 = ZEXT3264(local_9e0);
        uVar27 = vpcmpgtd_avx512vl(auVar151,local_660);
        uVar28 = vpcmpd_avx512vl(local_660,local_5e0,1);
        auVar219._0_4_ = fVar161 + (float)local_540._0_4_;
        auVar219._4_4_ = fVar191 + (float)local_540._4_4_;
        auVar219._8_4_ = fVar193 + fStack_538;
        auVar219._12_4_ = fVar195 + fStack_534;
        auVar219._16_4_ = fVar163 + fStack_530;
        auVar219._20_4_ = fVar197 + fStack_52c;
        auVar219._24_4_ = fVar199 + fStack_528;
        auVar219._28_4_ = fVar221 + fStack_524;
        uVar26 = vcmpps_avx512vl(auVar219,auVar172,2);
        bVar81 = bVar81 & (byte)uVar28 & (byte)uVar26;
        auVar220._0_4_ = fVar161 + local_640._0_4_;
        auVar220._4_4_ = fVar191 + local_640._4_4_;
        auVar220._8_4_ = fVar193 + local_640._8_4_;
        auVar220._12_4_ = fVar195 + local_640._12_4_;
        auVar220._16_4_ = fVar163 + local_640._16_4_;
        auVar220._20_4_ = fVar197 + local_640._20_4_;
        auVar220._24_4_ = fVar199 + local_640._24_4_;
        auVar220._28_4_ = fVar221 + local_640._28_4_;
        uVar26 = vcmpps_avx512vl(auVar220,auVar172,2);
        bVar75 = bVar75 & (byte)uVar27 & (byte)uVar26 | bVar81;
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar174 = ZEXT3264(auVar116);
        auVar253 = ZEXT3264(local_860);
        prim = local_910;
        if (bVar75 != 0) {
          abStack_1a0[uVar78 * 0x60] = bVar75;
          auVar153._0_4_ =
               (uint)(bVar81 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar81 & 1) * (int)local_640._0_4_;
          bVar11 = (bool)(bVar81 >> 1 & 1);
          auVar153._4_4_ = (uint)bVar11 * local_540._4_4_ | (uint)!bVar11 * (int)local_640._4_4_;
          bVar11 = (bool)(bVar81 >> 2 & 1);
          auVar153._8_4_ = (uint)bVar11 * (int)fStack_538 | (uint)!bVar11 * (int)local_640._8_4_;
          bVar11 = (bool)(bVar81 >> 3 & 1);
          auVar153._12_4_ = (uint)bVar11 * (int)fStack_534 | (uint)!bVar11 * (int)local_640._12_4_;
          bVar11 = (bool)(bVar81 >> 4 & 1);
          auVar153._16_4_ = (uint)bVar11 * (int)fStack_530 | (uint)!bVar11 * (int)local_640._16_4_;
          bVar11 = (bool)(bVar81 >> 5 & 1);
          auVar153._20_4_ = (uint)bVar11 * (int)fStack_52c | (uint)!bVar11 * (int)local_640._20_4_;
          auVar153._24_4_ =
               (uint)(bVar81 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar81 >> 6) * (int)local_640._24_4_;
          auVar153._28_4_ = local_640._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar153;
          uVar88 = vmovlps_avx(local_670);
          (&uStack_160)[uVar78 * 0xc] = uVar88;
          aiStack_158[uVar78 * 0x18] = iVar82 + 1;
          uVar78 = (ulong)((int)uVar78 + 1);
        }
      }
    }
    do {
      uVar90 = (uint)uVar78;
      uVar78 = (ulong)(uVar90 - 1);
      if (uVar90 == 0) {
        uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar44._4_4_ = uVar162;
        auVar44._0_4_ = uVar162;
        auVar44._8_4_ = uVar162;
        auVar44._12_4_ = uVar162;
        auVar44._16_4_ = uVar162;
        auVar44._20_4_ = uVar162;
        auVar44._24_4_ = uVar162;
        auVar44._28_4_ = uVar162;
        uVar26 = vcmpps_avx512vl(local_5c0,auVar44,2);
        uVar83 = (uint)uVar26 & (uint)local_908 - 1 & (uint)local_908;
        local_908 = (ulong)uVar83;
        if (uVar83 == 0) {
          return;
        }
        goto LAB_01ce4cda;
      }
      lVar84 = uVar78 * 0x60;
      auVar116 = *(undefined1 (*) [32])(auStack_180 + lVar84);
      auVar187._0_4_ = fVar161 + auVar116._0_4_;
      auVar187._4_4_ = fVar191 + auVar116._4_4_;
      auVar187._8_4_ = fVar193 + auVar116._8_4_;
      auVar187._12_4_ = fVar195 + auVar116._12_4_;
      auVar187._16_4_ = fVar163 + auVar116._16_4_;
      auVar187._20_4_ = fVar197 + auVar116._20_4_;
      auVar187._24_4_ = fVar199 + auVar116._24_4_;
      auVar187._28_4_ = fVar221 + auVar116._28_4_;
      uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar43._4_4_ = uVar162;
      auVar43._0_4_ = uVar162;
      auVar43._8_4_ = uVar162;
      auVar43._12_4_ = uVar162;
      auVar43._16_4_ = uVar162;
      auVar43._20_4_ = uVar162;
      auVar43._24_4_ = uVar162;
      auVar43._28_4_ = uVar162;
      uVar26 = vcmpps_avx512vl(auVar187,auVar43,2);
      uVar89 = (uint)uVar26 & (uint)abStack_1a0[lVar84];
    } while (uVar89 == 0);
    uVar88 = (&uStack_160)[uVar78 * 0xc];
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar88;
    auVar217._8_4_ = 0x7f800000;
    auVar217._0_8_ = 0x7f8000007f800000;
    auVar217._12_4_ = 0x7f800000;
    auVar217._16_4_ = 0x7f800000;
    auVar217._20_4_ = 0x7f800000;
    auVar217._24_4_ = 0x7f800000;
    auVar217._28_4_ = 0x7f800000;
    auVar106 = vblendmps_avx512vl(auVar217,auVar116);
    bVar75 = (byte)uVar89;
    auVar149._0_4_ =
         (uint)(bVar75 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)auVar116._0_4_;
    bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
    auVar149._4_4_ = (uint)bVar11 * auVar106._4_4_ | (uint)!bVar11 * (int)auVar116._4_4_;
    bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
    auVar149._8_4_ = (uint)bVar11 * auVar106._8_4_ | (uint)!bVar11 * (int)auVar116._8_4_;
    bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
    auVar149._12_4_ = (uint)bVar11 * auVar106._12_4_ | (uint)!bVar11 * (int)auVar116._12_4_;
    bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
    auVar149._16_4_ = (uint)bVar11 * auVar106._16_4_ | (uint)!bVar11 * (int)auVar116._16_4_;
    bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
    auVar149._20_4_ = (uint)bVar11 * auVar106._20_4_ | (uint)!bVar11 * (int)auVar116._20_4_;
    bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
    auVar149._24_4_ = (uint)bVar11 * auVar106._24_4_ | (uint)!bVar11 * (int)auVar116._24_4_;
    auVar149._28_4_ =
         (uVar89 >> 7) * auVar106._28_4_ | (uint)!SUB41(uVar89 >> 7,0) * (int)auVar116._28_4_;
    auVar116 = vshufps_avx(auVar149,auVar149,0xb1);
    auVar116 = vminps_avx(auVar149,auVar116);
    auVar106 = vshufpd_avx(auVar116,auVar116,5);
    auVar116 = vminps_avx(auVar116,auVar106);
    auVar106 = vpermpd_avx2(auVar116,0x4e);
    auVar116 = vminps_avx(auVar116,auVar106);
    uVar26 = vcmpps_avx512vl(auVar149,auVar116,0);
    bVar80 = (byte)uVar26 & bVar75;
    if (bVar80 != 0) {
      uVar89 = (uint)bVar80;
    }
    uVar154 = 0;
    for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
      uVar154 = uVar154 + 1;
    }
    iVar82 = aiStack_158[uVar78 * 0x18];
    bVar75 = ~('\x01' << ((byte)uVar154 & 0x1f)) & bVar75;
    abStack_1a0[lVar84] = bVar75;
    if (bVar75 == 0) {
      uVar90 = uVar90 - 1;
    }
    uVar162 = (undefined4)uVar88;
    auVar169._4_4_ = uVar162;
    auVar169._0_4_ = uVar162;
    auVar169._8_4_ = uVar162;
    auVar169._12_4_ = uVar162;
    auVar169._16_4_ = uVar162;
    auVar169._20_4_ = uVar162;
    auVar169._24_4_ = uVar162;
    auVar169._28_4_ = uVar162;
    auVar91 = vmovshdup_avx(auVar176);
    auVar91 = vsubps_avx(auVar91,auVar176);
    auVar188._0_4_ = auVar91._0_4_;
    auVar188._4_4_ = auVar188._0_4_;
    auVar188._8_4_ = auVar188._0_4_;
    auVar188._12_4_ = auVar188._0_4_;
    auVar188._16_4_ = auVar188._0_4_;
    auVar188._20_4_ = auVar188._0_4_;
    auVar188._24_4_ = auVar188._0_4_;
    auVar188._28_4_ = auVar188._0_4_;
    auVar91 = vfmadd132ps_fma(auVar188,auVar169,_DAT_01faff20);
    auVar116 = ZEXT1632(auVar91);
    local_400[0] = (RTCHitN)auVar116[0];
    local_400[1] = (RTCHitN)auVar116[1];
    local_400[2] = (RTCHitN)auVar116[2];
    local_400[3] = (RTCHitN)auVar116[3];
    local_400[4] = (RTCHitN)auVar116[4];
    local_400[5] = (RTCHitN)auVar116[5];
    local_400[6] = (RTCHitN)auVar116[6];
    local_400[7] = (RTCHitN)auVar116[7];
    local_400[8] = (RTCHitN)auVar116[8];
    local_400[9] = (RTCHitN)auVar116[9];
    local_400[10] = (RTCHitN)auVar116[10];
    local_400[0xb] = (RTCHitN)auVar116[0xb];
    local_400[0xc] = (RTCHitN)auVar116[0xc];
    local_400[0xd] = (RTCHitN)auVar116[0xd];
    local_400[0xe] = (RTCHitN)auVar116[0xe];
    local_400[0xf] = (RTCHitN)auVar116[0xf];
    local_400[0x10] = (RTCHitN)auVar116[0x10];
    local_400[0x11] = (RTCHitN)auVar116[0x11];
    local_400[0x12] = (RTCHitN)auVar116[0x12];
    local_400[0x13] = (RTCHitN)auVar116[0x13];
    local_400[0x14] = (RTCHitN)auVar116[0x14];
    local_400[0x15] = (RTCHitN)auVar116[0x15];
    local_400[0x16] = (RTCHitN)auVar116[0x16];
    local_400[0x17] = (RTCHitN)auVar116[0x17];
    local_400[0x18] = (RTCHitN)auVar116[0x18];
    local_400[0x19] = (RTCHitN)auVar116[0x19];
    local_400[0x1a] = (RTCHitN)auVar116[0x1a];
    local_400[0x1b] = (RTCHitN)auVar116[0x1b];
    local_400[0x1c] = (RTCHitN)auVar116[0x1c];
    local_400[0x1d] = (RTCHitN)auVar116[0x1d];
    local_400[0x1e] = (RTCHitN)auVar116[0x1e];
    local_400[0x1f] = (RTCHitN)auVar116[0x1f];
    local_670._8_8_ = 0;
    local_670._0_8_ = *(ulong *)(local_400 + (ulong)uVar154 * 4);
    uVar78 = (ulong)uVar90;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }